

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack1to8.h
# Opt level: O1

void ncnn::conv3x3s1_pack1to8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  undefined8 uVar52;
  undefined8 uVar53;
  undefined8 uVar54;
  undefined8 uVar55;
  undefined8 uVar56;
  undefined8 uVar57;
  undefined8 uVar58;
  undefined1 auVar59 [12];
  undefined1 auVar60 [28];
  undefined1 auVar61 [28];
  undefined1 auVar62 [28];
  undefined1 (*pauVar63) [32];
  undefined1 (*pauVar64) [32];
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  undefined1 (*pauVar69) [32];
  int iVar70;
  undefined1 (*pauVar71) [32];
  undefined1 (*pauVar72) [32];
  int iVar73;
  void *pvVar74;
  ulong uVar75;
  undefined1 (*pauVar76) [32];
  undefined1 (*pauVar77) [32];
  ulong uVar78;
  float *pfVar79;
  ulong uVar80;
  long lVar81;
  void *pvVar82;
  ulong uVar83;
  void *pvVar84;
  undefined1 (*pauVar85) [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 in_ZMM1 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar102;
  float fVar103;
  undefined1 auVar104 [32];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar116 [64];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar128 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar129 [64];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float in_register_0000159c;
  float fVar144;
  ulong local_338;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined8 *local_1b8;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 auVar130 [64];
  
  uVar5 = bottom_blob->c;
  uVar6 = top_blob->w;
  iVar7 = top_blob->h;
  iVar8 = top_blob->c;
  pvVar9 = _bias->data;
  uVar83 = (long)iVar8 & 0xfffffffffffffffe;
  if (0 < iVar8 >> 1) {
    uVar78 = 0;
    do {
      uVar75 = (long)top_blob->h * (long)top_blob->w;
      uVar67 = top_blob->elemsize;
      uVar80 = (uVar67 * uVar75 + 0xf & 0xfffffffffffffff0) / uVar67;
      if (top_blob->dims == 4) {
        uVar80 = uVar75;
      }
      auVar86 = ZEXT1632(ZEXT816(0) << 0x40);
      in_ZMM1 = ZEXT1664(ZEXT816(0) << 0x40);
      if (pvVar9 != (void *)0x0) {
        in_ZMM1 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar9 + uVar78 * 0x40));
      }
      lVar68 = uVar67 * top_blob->cstep;
      pvVar74 = top_blob->data;
      lVar81 = uVar78 * 2 + 1;
      iVar70 = top_blob->d;
      if (pvVar9 != (void *)0x0) {
        auVar86 = *(undefined1 (*) [32])((long)pvVar9 + lVar81 * 0x20);
      }
      pauVar76 = (undefined1 (*) [32])(lVar68 * uVar78 * 2 + (long)pvVar74);
      iVar73 = iVar70 * (int)uVar80;
      pauVar71 = pauVar76;
      if (0 < iVar73) {
        do {
          *pauVar71 = in_ZMM1._0_32_;
          iVar73 = iVar73 + -1;
          pauVar71 = pauVar71 + 1;
        } while (iVar73 != 0);
      }
      pauVar71 = (undefined1 (*) [32])((long)pvVar74 + lVar68 * lVar81);
      iVar70 = iVar70 * (int)uVar80;
      pauVar77 = pauVar71;
      if (0 < iVar70) {
        do {
          *pauVar77 = auVar86;
          iVar70 = iVar70 + -1;
          pauVar77 = pauVar77 + 1;
        } while (iVar70 != 0);
      }
      if (0 < (int)uVar5) {
        pfVar79 = (float *)(lVar81 * kernel->elemsize * kernel->cstep + (long)kernel->data);
        local_1b8 = (undefined8 *)
                    (uVar78 * 2 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        local_338 = 0;
        do {
          if (0 < iVar7) {
            uVar43 = *local_1b8;
            uVar44 = local_1b8[1];
            uVar45 = local_1b8[2];
            uVar46 = local_1b8[3];
            uVar47 = local_1b8[4];
            uVar48 = local_1b8[5];
            uVar49 = local_1b8[6];
            uVar50 = local_1b8[7];
            uVar51 = *(undefined8 *)*(undefined1 (*) [12])(local_1b8 + 8);
            auVar59 = *(undefined1 (*) [12])(local_1b8 + 8);
            local_b8 = (float)uVar51;
            fStack_b4 = (float)((ulong)uVar51 >> 0x20);
            fStack_b0 = (float)local_1b8[9];
            fStack_ac = (float)((ulong)local_1b8[9] >> 0x20);
            fStack_a8 = (float)local_1b8[10];
            fStack_a4 = (float)((ulong)local_1b8[10] >> 0x20);
            fStack_a0 = (float)local_1b8[0xb];
            fStack_9c = (float)((ulong)local_1b8[0xb] >> 0x20);
            auVar86 = *(undefined1 (*) [32])(local_1b8 + 0xc);
            auVar3 = *(undefined1 (*) [32])(local_1b8 + 0x10);
            auVar4 = *(undefined1 (*) [32])(local_1b8 + 0x14);
            fVar91 = *(float *)(local_1b8 + 0x18);
            fVar106 = *(float *)((long)local_1b8 + 0xc4);
            fVar90 = *(float *)(local_1b8 + 0x19);
            fVar93 = *(float *)((long)local_1b8 + 0xcc);
            fVar10 = *(float *)(local_1b8 + 0x1a);
            fVar11 = *(float *)((long)local_1b8 + 0xd4);
            fVar12 = *(float *)(local_1b8 + 0x1b);
            fVar13 = *(float *)(local_1b8 + 0x1c);
            fVar14 = *(float *)((long)local_1b8 + 0xe4);
            fVar15 = *(float *)(local_1b8 + 0x1d);
            fVar16 = *(float *)((long)local_1b8 + 0xec);
            fVar17 = *(float *)(local_1b8 + 0x1e);
            fVar18 = *(float *)((long)local_1b8 + 0xf4);
            fVar19 = *(float *)(local_1b8 + 0x1f);
            fVar20 = *(float *)(local_1b8 + 0x20);
            fVar21 = *(float *)((long)local_1b8 + 0x104);
            fVar22 = *(float *)(local_1b8 + 0x21);
            fVar23 = *(float *)((long)local_1b8 + 0x10c);
            fVar24 = *(float *)(local_1b8 + 0x22);
            fVar25 = *(float *)((long)local_1b8 + 0x114);
            fVar26 = *(float *)(local_1b8 + 0x23);
            fVar113 = *(float *)((long)local_1b8 + 0x11c);
            fVar97 = *pfVar79;
            fVar36 = pfVar79[1];
            fVar120 = pfVar79[2];
            fVar37 = pfVar79[3];
            fVar122 = pfVar79[4];
            fVar38 = pfVar79[5];
            fVar39 = pfVar79[6];
            in_register_0000159c = pfVar79[7];
            fVar92 = pfVar79[8];
            fVar98 = pfVar79[9];
            fVar144 = pfVar79[10];
            fVar119 = pfVar79[0xb];
            fVar94 = pfVar79[0xc];
            fVar96 = pfVar79[0xd];
            fVar27 = pfVar79[0xe];
            fVar115 = pfVar79[0xf];
            auVar60 = *(undefined1 (*) [28])*(undefined1 (*) [32])(pfVar79 + 0x10);
            fVar35 = pfVar79[0x17];
            auVar89 = *(undefined1 (*) [32])(pfVar79 + 0x10);
            auVar87 = *(undefined1 (*) [32])(pfVar79 + 0x18);
            auVar116 = ZEXT3264(auVar87);
            fVar138 = *(float *)*(undefined1 (*) [28])(pfVar79 + 0x20);
            fVar40 = pfVar79[0x21];
            fVar95 = pfVar79[0x22];
            fVar41 = pfVar79[0x23];
            fVar102 = pfVar79[0x24];
            fVar42 = pfVar79[0x25];
            fVar105 = pfVar79[0x26];
            auVar61 = *(undefined1 (*) [28])(pfVar79 + 0x20);
            uVar51 = *(undefined8 *)(pfVar79 + 0x28);
            uVar52 = *(undefined8 *)(pfVar79 + 0x2a);
            uVar53 = *(undefined8 *)(pfVar79 + 0x2c);
            uVar54 = *(undefined8 *)(pfVar79 + 0x2e);
            auVar88 = *(undefined1 (*) [32])(pfVar79 + 0x30);
            auVar129 = ZEXT3264(auVar88);
            pvVar84 = (void *)(bottom_blob->cstep * local_338 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar81 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar74 = (void *)((long)pvVar84 + lVar81 * 2);
            pvVar82 = (void *)(lVar81 + (long)pvVar84);
            iVar70 = 0;
            uVar55 = *(undefined8 *)(pfVar79 + 0x38);
            uVar56 = *(undefined8 *)(pfVar79 + 0x3a);
            uVar57 = *(undefined8 *)(pfVar79 + 0x3c);
            uVar58 = *(undefined8 *)(pfVar79 + 0x3e);
            fVar28 = pfVar79[0x40];
            fVar29 = pfVar79[0x41];
            fVar30 = pfVar79[0x42];
            fVar31 = pfVar79[0x43];
            fVar32 = pfVar79[0x44];
            fVar33 = pfVar79[0x45];
            fVar34 = pfVar79[0x46];
            fVar142 = pfVar79[0x47];
            pauVar77 = pauVar71;
            pauVar85 = pauVar76;
            fVar140 = fVar35;
            do {
              local_2a8 = (float)uVar43;
              fStack_2a0 = (float)uVar44;
              fStack_298 = (float)uVar45;
              local_d8 = (float)uVar47;
              fStack_d4 = (float)((ulong)uVar47 >> 0x20);
              fStack_d0 = (float)uVar48;
              fStack_cc = (float)((ulong)uVar48 >> 0x20);
              fStack_c8 = (float)uVar49;
              fStack_c4 = (float)((ulong)uVar49 >> 0x20);
              fStack_c0 = (float)uVar50;
              local_248 = auVar86._0_4_;
              fStack_240 = auVar86._8_4_;
              fStack_23c = auVar86._12_4_;
              fStack_238 = auVar86._16_4_;
              fStack_234 = auVar86._20_4_;
              fStack_230 = auVar86._24_4_;
              local_228 = auVar3._0_4_;
              fStack_224 = auVar3._4_4_;
              fStack_220 = auVar3._8_4_;
              fStack_21c = auVar3._12_4_;
              fStack_218 = auVar3._16_4_;
              fStack_214 = auVar3._20_4_;
              fStack_210 = auVar3._24_4_;
              fStack_264 = auVar4._4_4_;
              fStack_260 = auVar4._8_4_;
              fStack_25c = auVar4._12_4_;
              fStack_258 = auVar4._16_4_;
              fStack_254 = auVar4._20_4_;
              fStack_250 = auVar4._24_4_;
              local_208 = auVar89._0_4_;
              fVar126 = local_208;
              fStack_204 = auVar89._4_4_;
              fStack_200 = auVar89._8_4_;
              fStack_1fc = auVar89._12_4_;
              fStack_1f8 = auVar89._16_4_;
              fStack_1f4 = auVar89._20_4_;
              fStack_1f0 = auVar89._24_4_;
              local_188 = auVar87._0_4_;
              fStack_184 = auVar87._4_4_;
              fStack_180 = auVar87._8_4_;
              fStack_17c = auVar87._12_4_;
              fStack_178 = auVar87._16_4_;
              fStack_174 = auVar87._20_4_;
              fStack_170 = auVar87._24_4_;
              local_328 = (float)uVar51;
              fStack_320 = (float)uVar52;
              fStack_318 = (float)uVar53;
              fStack_f4 = auVar88._4_4_;
              fStack_f0 = auVar88._8_4_;
              fStack_ec = auVar88._12_4_;
              fStack_e8 = auVar88._16_4_;
              fStack_e4 = auVar88._20_4_;
              fStack_e0 = auVar88._24_4_;
              local_2c8 = (float)uVar55;
              fStack_2c0 = (float)uVar56;
              fStack_2b8 = (float)uVar57;
              fStack_290 = (float)uVar46;
              fStack_310 = (float)uVar54;
              fStack_2b0 = (float)uVar58;
              fStack_2a4 = (float)((ulong)uVar43 >> 0x20);
              fStack_29c = (float)((ulong)uVar44 >> 0x20);
              fStack_294 = (float)((ulong)uVar45 >> 0x20);
              fStack_244 = auVar86._4_4_;
              fStack_324 = (float)((ulong)uVar51 >> 0x20);
              fStack_31c = (float)((ulong)uVar52 >> 0x20);
              fStack_314 = (float)((ulong)uVar53 >> 0x20);
              local_f8 = auVar88._0_4_;
              fStack_2c4 = (float)((ulong)uVar55 >> 0x20);
              fStack_2bc = (float)((ulong)uVar56 >> 0x20);
              fStack_2b4 = (float)((ulong)uVar57 >> 0x20);
              local_268 = auVar4._0_4_;
              if ((int)uVar6 < 4) {
                uVar66 = 0;
              }
              else {
                iVar73 = 3;
                lVar81 = 0;
                pauVar63 = pauVar77;
                pauVar64 = pauVar85;
                do {
                  pauVar72 = pauVar64;
                  pauVar69 = pauVar63;
                  fVar110 = *(float *)((long)pvVar84 + lVar81);
                  fVar111 = *(float *)((long)pvVar84 + lVar81 + 4);
                  fVar103 = *(float *)((long)pvVar84 + lVar81 + 8);
                  fVar108 = *(float *)((long)pvVar82 + lVar81);
                  fVar121 = *(float *)((long)pvVar82 + lVar81 + 4);
                  pfVar1 = (float *)((long)*pauVar85 + lVar81 * 2 * 4);
                  fVar107 = *(float *)((long)pvVar82 + lVar81 + 8);
                  fVar137 = *(float *)((long)pvVar74 + lVar81);
                  pfVar2 = (float *)((long)*pauVar77 + lVar81 * 2 * 4);
                  fVar139 = *(float *)((long)pvVar74 + lVar81 + 4);
                  fVar114 = fVar140 + fVar115 + pfVar1[7];
                  fVar134 = auVar129._28_4_ + fVar142 + fVar142 + fVar142 + fVar114;
                  local_208 = auVar60._0_4_;
                  fVar143 = fVar140 + fVar114;
                  fVar115 = *(float *)((long)pvVar74 + lVar81 + 8);
                  fVar142 = *pfVar2;
                  fVar109 = pfVar2[1];
                  fVar127 = pfVar2[2];
                  fVar131 = pfVar2[3];
                  fVar132 = pfVar2[4];
                  fVar133 = pfVar2[5];
                  fVar117 = pfVar2[6];
                  fVar112 = fVar143 + fVar110 + pfVar2[7];
                  fVar140 = fVar140 + fVar114 + fVar143;
                  fVar114 = fVar143 + fVar108 + fVar143 + fVar112;
                  fVar123 = fVar140 + fVar134;
                  fVar112 = fVar134 + fVar112 + fVar137 + fVar114;
                  *pfVar1 = fVar137 * fVar91 + fVar121 * local_228 + fVar110 * local_2a8 + *pfVar1 +
                            fVar115 * fVar20 +
                            fVar111 * local_d8 + fVar103 * local_b8 + fVar108 * local_248 +
                            fVar107 * local_268 + fVar139 * fVar13;
                  pfVar1[1] = fVar137 * fVar106 +
                              fVar121 * fStack_224 + fVar110 * fStack_2a4 + pfVar1[1] +
                              fVar115 * fVar21 +
                              fVar111 * fStack_d4 + fVar103 * fStack_b4 + fVar108 * fStack_244 +
                              fVar107 * fStack_264 + fVar139 * fVar14;
                  pfVar1[2] = fVar137 * fVar90 +
                              fVar121 * fStack_220 + fVar110 * fStack_2a0 + pfVar1[2] +
                              fVar115 * fVar22 +
                              fVar111 * fStack_d0 + fVar103 * fStack_b0 + fVar108 * fStack_240 +
                              fVar107 * fStack_260 + fVar139 * fVar15;
                  pfVar1[3] = fVar137 * fVar93 +
                              fVar121 * fStack_21c + fVar110 * fStack_29c + pfVar1[3] +
                              fVar115 * fVar23 +
                              fVar111 * fStack_cc + fVar103 * fStack_ac + fVar108 * fStack_23c +
                              fVar107 * fStack_25c + fVar139 * fVar16;
                  pfVar1[4] = fVar137 * fVar10 +
                              fVar121 * fStack_218 + fVar110 * fStack_298 + pfVar1[4] +
                              fVar115 * fVar24 +
                              fVar111 * fStack_c8 + fVar103 * fStack_a8 + fVar108 * fStack_238 +
                              fVar107 * fStack_258 + fVar139 * fVar17;
                  pfVar1[5] = fVar137 * fVar11 +
                              fVar121 * fStack_214 + fVar110 * fStack_294 + pfVar1[5] +
                              fVar115 * fVar25 +
                              fVar111 * fStack_c4 + fVar103 * fStack_a4 + fVar108 * fStack_234 +
                              fVar107 * fStack_254 + fVar139 * fVar18;
                  pfVar1[6] = fVar137 * fVar12 +
                              fVar121 * fStack_210 + fVar110 * fStack_290 + pfVar1[6] +
                              fVar115 * fVar26 +
                              fVar111 * fStack_c0 + fVar103 * fStack_a0 + fVar108 * fStack_230 +
                              fVar107 * fStack_250 + fVar139 * fVar19;
                  pfVar1[7] = fVar123;
                  *pfVar2 = fVar115 * fVar28 +
                            fVar121 * fVar138 + fVar110 * fVar97 + fVar142 + fVar137 * local_f8 +
                            fVar111 * fVar92 + fVar103 * local_208 + fVar108 * local_188 +
                            fVar107 * local_328 + fVar139 * local_2c8;
                  pfVar2[1] = fVar115 * fVar29 +
                              fVar121 * fVar40 + fVar110 * fVar36 + fVar109 + fVar137 * fStack_f4 +
                              fVar111 * fVar98 + fVar103 * fStack_204 + fVar108 * fStack_184 +
                              fVar107 * fStack_324 + fVar139 * fStack_2c4;
                  pfVar2[2] = fVar115 * fVar30 +
                              fVar121 * fVar95 + fVar110 * fVar120 + fVar127 + fVar137 * fStack_f0 +
                              fVar111 * fVar144 + fVar103 * fStack_200 + fVar108 * fStack_180 +
                              fVar107 * fStack_320 + fVar139 * fStack_2c0;
                  pfVar2[3] = fVar115 * fVar31 +
                              fVar121 * fVar41 + fVar110 * fVar37 + fVar131 + fVar137 * fStack_ec +
                              fVar111 * fVar119 + fVar103 * fStack_1fc + fVar108 * fStack_17c +
                              fVar107 * fStack_31c + fVar139 * fStack_2bc;
                  pfVar2[4] = fVar115 * fVar32 +
                              fVar121 * fVar102 + fVar110 * fVar122 + fVar132 + fVar137 * fStack_e8
                              + fVar111 * fVar94 + fVar103 * fStack_1f8 + fVar108 * fStack_178 +
                                fVar107 * fStack_318 + fVar139 * fStack_2b8;
                  pfVar2[5] = fVar115 * fVar33 +
                              fVar121 * fVar42 + fVar110 * fVar38 + fVar133 + fVar137 * fStack_e4 +
                              fVar111 * fVar96 + fVar103 * fStack_1f4 + fVar108 * fStack_174 +
                              fVar107 * fStack_314 + fVar139 * fStack_2b4;
                  pfVar2[6] = fVar115 * fVar34 +
                              fVar121 * fVar105 + fVar110 * fVar39 + fVar117 + fVar137 * fStack_e0 +
                              fVar111 * fVar27 + fVar103 * fStack_1f0 + fVar108 * fStack_170 +
                              fVar107 * fStack_310 + fVar139 * fStack_2b0;
                  pfVar2[7] = fVar112;
                  fVar123 = fVar123 + fVar114;
                  fVar110 = *(float *)((long)pvVar84 + lVar81 + 0xc);
                  fVar108 = *(float *)((long)pvVar82 + lVar81 + 0xc);
                  fVar140 = fVar140 + fVar111;
                  fVar137 = *(float *)((long)pvVar74 + lVar81 + 0xc);
                  fStack_16c = auVar87._28_4_;
                  fVar117 = fVar140 + fVar121 + fVar143;
                  fVar135 = fVar134 + fVar143 + fVar143 + fVar143;
                  fVar134 = fVar140 + fVar143 + fVar117;
                  fVar140 = pfVar2[8];
                  fVar142 = pfVar2[9];
                  fVar109 = pfVar2[10];
                  fVar127 = pfVar2[0xb];
                  fVar131 = pfVar2[0xc];
                  fVar132 = pfVar2[0xd];
                  fVar133 = pfVar2[0xe];
                  fVar112 = fVar114 + fVar112 + fVar123 + fVar123 + pfVar1[0xf] + fVar135;
                  fVar117 = fVar117 + fVar110 + fVar143 + pfVar2[0xf] + fVar134;
                  pfVar1[8] = fVar103 * local_d8 + fVar111 * local_2a8 +
                              local_228 * fVar107 + fVar121 * local_248 + fVar139 * fVar91 +
                              pfVar1[8] +
                              fVar13 * fVar115 + fVar110 * local_b8 + fVar108 * local_268 +
                              fVar137 * fVar20;
                  pfVar1[9] = fVar103 * fStack_d4 + fVar111 * fStack_2a4 +
                              fStack_224 * fVar107 + fVar121 * fStack_244 + fVar139 * fVar106 +
                              pfVar1[9] +
                              fVar14 * fVar115 + fVar110 * fStack_b4 + fVar108 * fStack_264 +
                              fVar137 * fVar21;
                  pfVar1[10] = fVar103 * fStack_d0 + fVar111 * fStack_2a0 +
                               fStack_220 * fVar107 + fVar121 * fStack_240 + fVar139 * fVar90 +
                               pfVar1[10] +
                               fVar15 * fVar115 + fVar110 * fStack_b0 + fVar108 * fStack_260 +
                               fVar137 * fVar22;
                  pfVar1[0xb] = fVar103 * fStack_cc + fVar111 * fStack_29c +
                                fStack_21c * fVar107 + fVar121 * fStack_23c + fVar139 * fVar93 +
                                pfVar1[0xb] +
                                fVar16 * fVar115 + fVar110 * fStack_ac + fVar108 * fStack_25c +
                                fVar137 * fVar23;
                  pfVar1[0xc] = fVar103 * fStack_c8 + fVar111 * fStack_298 +
                                fStack_218 * fVar107 + fVar121 * fStack_238 + fVar139 * fVar10 +
                                pfVar1[0xc] +
                                fVar17 * fVar115 + fVar110 * fStack_a8 + fVar108 * fStack_258 +
                                fVar137 * fVar24;
                  pfVar1[0xd] = fVar103 * fStack_c4 + fVar111 * fStack_294 +
                                fStack_214 * fVar107 + fVar121 * fStack_234 + fVar139 * fVar11 +
                                pfVar1[0xd] +
                                fVar18 * fVar115 + fVar110 * fStack_a4 + fVar108 * fStack_254 +
                                fVar137 * fVar25;
                  pfVar1[0xe] = fVar103 * fStack_c0 + fVar111 * fStack_290 +
                                fStack_210 * fVar107 + fVar121 * fStack_230 + fVar139 * fVar12 +
                                pfVar1[0xe] +
                                fVar19 * fVar115 + fVar110 * fStack_a0 + fVar108 * fStack_250 +
                                fVar137 * fVar26;
                  pfVar1[0xf] = fVar112;
                  pfVar2[8] = fVar103 * fVar92 + fVar111 * fVar97 +
                              fVar121 * local_188 + fVar107 * fVar138 +
                              fVar139 * local_f8 + fVar115 * local_2c8 + fVar140 +
                              fVar110 * local_208 + fVar108 * local_328 + fVar137 * fVar28;
                  pfVar2[9] = fVar103 * fVar98 + fVar111 * fVar36 +
                              fVar121 * fStack_184 + fVar107 * fVar40 +
                              fVar139 * fStack_f4 + fVar115 * fStack_2c4 + fVar142 +
                              fVar110 * fStack_204 + fVar108 * fStack_324 + fVar137 * fVar29;
                  pfVar2[10] = fVar103 * fVar144 + fVar111 * fVar120 +
                               fVar121 * fStack_180 + fVar107 * fVar95 +
                               fVar139 * fStack_f0 + fVar115 * fStack_2c0 + fVar109 +
                               fVar110 * fStack_200 + fVar108 * fStack_320 + fVar137 * fVar30;
                  pfVar2[0xb] = fVar103 * fVar119 + fVar111 * fVar37 +
                                fVar121 * fStack_17c + fVar107 * fVar41 +
                                fVar139 * fStack_ec + fVar115 * fStack_2bc + fVar127 +
                                fVar110 * fStack_1fc + fVar108 * fStack_31c + fVar137 * fVar31;
                  pfVar2[0xc] = fVar103 * fVar94 + fVar111 * fVar122 +
                                fVar121 * fStack_178 + fVar107 * fVar102 +
                                fVar139 * fStack_e8 + fVar115 * fStack_2b8 + fVar131 +
                                fVar110 * fStack_1f8 + fVar108 * fStack_318 + fVar137 * fVar32;
                  pfVar2[0xd] = fVar103 * fVar96 + fVar111 * fVar38 +
                                fVar121 * fStack_174 + fVar107 * fVar42 +
                                fVar139 * fStack_e4 + fVar115 * fStack_2b4 + fVar132 +
                                fVar110 * fStack_1f4 + fVar108 * fStack_314 + fVar137 * fVar33;
                  pfVar2[0xe] = fVar103 * fVar27 + fVar111 * fVar39 +
                                fVar121 * fStack_170 + fVar107 * fVar105 +
                                fVar139 * fStack_e0 + fVar115 * fStack_2b0 + fVar133 +
                                fVar110 * fStack_1f0 + fVar108 * fStack_310 + fVar137 * fVar34;
                  pfVar2[0xf] = fVar117;
                  fVar111 = *(float *)((long)pvVar84 + lVar81 + 0x10);
                  fVar121 = *(float *)((long)pvVar82 + lVar81 + 0x10);
                  fVar139 = *(float *)((long)pvVar74 + lVar81 + 0x10);
                  fVar141 = fVar103 + fVar110;
                  in_ZMM1 = ZEXT3264(auVar4);
                  fVar143 = fVar135 + fVar103 + fVar110 + fVar110;
                  fVar112 = fVar112 + fVar117 + fVar117 + fVar134 + fVar135 + pfVar1[0x17] + fVar143
                  ;
                  fVar140 = pfVar2[0x10];
                  fVar142 = pfVar2[0x11];
                  fVar109 = pfVar2[0x12];
                  fVar127 = pfVar2[0x13];
                  fVar131 = pfVar2[0x14];
                  fVar132 = pfVar2[0x15];
                  fVar133 = pfVar2[0x16];
                  fVar117 = pfVar2[0x17];
                  pfVar1[0x10] = fVar107 * local_248 + fVar103 * local_2a8 +
                                 fVar115 * fVar91 + fVar110 * local_d8 + fVar108 * local_228 +
                                 pfVar1[0x10] +
                                 fVar137 * fVar13 + fVar111 * local_b8 + fVar121 * local_268 +
                                 fVar139 * fVar20;
                  pfVar1[0x11] = fVar107 * fStack_244 + fVar103 * fStack_2a4 +
                                 fVar115 * fVar106 + fVar110 * fStack_d4 + fVar108 * fStack_224 +
                                 pfVar1[0x11] +
                                 fVar137 * fVar14 + fVar111 * fStack_b4 + fVar121 * fStack_264 +
                                 fVar139 * fVar21;
                  pfVar1[0x12] = fVar107 * fStack_240 + fVar103 * fStack_2a0 +
                                 fVar115 * fVar90 + fVar110 * fStack_d0 + fVar108 * fStack_220 +
                                 pfVar1[0x12] +
                                 fVar137 * fVar15 + fVar111 * fStack_b0 + fVar121 * fStack_260 +
                                 fVar139 * fVar22;
                  pfVar1[0x13] = fVar107 * fStack_23c + fVar103 * fStack_29c +
                                 fVar115 * fVar93 + fVar110 * fStack_cc + fVar108 * fStack_21c +
                                 pfVar1[0x13] +
                                 fVar137 * fVar16 + fVar111 * fStack_ac + fVar121 * fStack_25c +
                                 fVar139 * fVar23;
                  pfVar1[0x14] = fVar107 * fStack_238 + fVar103 * fStack_298 +
                                 fVar115 * fVar10 + fVar110 * fStack_c8 + fVar108 * fStack_218 +
                                 pfVar1[0x14] +
                                 fVar137 * fVar17 + fVar111 * fStack_a8 + fVar121 * fStack_258 +
                                 fVar139 * fVar24;
                  pfVar1[0x15] = fVar107 * fStack_234 + fVar103 * fStack_294 +
                                 fVar115 * fVar11 + fVar110 * fStack_c4 + fVar108 * fStack_214 +
                                 pfVar1[0x15] +
                                 fVar137 * fVar18 + fVar111 * fStack_a4 + fVar121 * fStack_254 +
                                 fVar139 * fVar25;
                  pfVar1[0x16] = fVar107 * fStack_230 + fVar103 * fStack_290 +
                                 fVar115 * fVar12 + fVar110 * fStack_c0 + fVar108 * fStack_210 +
                                 pfVar1[0x16] +
                                 fVar137 * fVar19 + fVar111 * fStack_a0 + fVar121 * fStack_250 +
                                 fVar139 * fVar26;
                  pfVar1[0x17] = fVar112;
                  pfVar2[0x10] = fVar108 * auVar61._0_4_ + fVar137 * local_2c8 +
                                 fVar103 * fVar97 + fVar107 * local_188 +
                                 fVar110 * fVar92 + fVar115 * local_f8 + fVar140 +
                                 fVar139 * fVar28 + fVar111 * local_208 + fVar121 * local_328;
                  pfVar2[0x11] = fVar108 * auVar61._4_4_ + fVar137 * fStack_2c4 +
                                 fVar103 * fVar36 + fVar107 * fStack_184 +
                                 fVar110 * fVar98 + fVar115 * fStack_f4 + fVar142 +
                                 fVar139 * fVar29 + fVar111 * fStack_204 + fVar121 * fStack_324;
                  pfVar2[0x12] = fVar108 * auVar61._8_4_ + fVar137 * fStack_2c0 +
                                 fVar103 * fVar120 + fVar107 * fStack_180 +
                                 fVar110 * fVar144 + fVar115 * fStack_f0 + fVar109 +
                                 fVar139 * fVar30 + fVar111 * fStack_200 + fVar121 * fStack_320;
                  pfVar2[0x13] = fVar108 * auVar61._12_4_ + fVar137 * fStack_2bc +
                                 fVar103 * fVar37 + fVar107 * fStack_17c +
                                 fVar110 * fVar119 + fVar115 * fStack_ec + fVar127 +
                                 fVar139 * fVar31 + fVar111 * fStack_1fc + fVar121 * fStack_31c;
                  pfVar2[0x14] = fVar108 * auVar61._16_4_ + fVar137 * fStack_2b8 +
                                 fVar103 * fVar122 + fVar107 * fStack_178 +
                                 fVar110 * fVar94 + fVar115 * fStack_e8 + fVar131 +
                                 fVar139 * fVar32 + fVar111 * fStack_1f8 + fVar121 * fStack_318;
                  pfVar2[0x15] = fVar108 * auVar61._20_4_ + fVar137 * fStack_2b4 +
                                 fVar103 * fVar38 + fVar107 * fStack_174 +
                                 fVar110 * fVar96 + fVar115 * fStack_e4 + fVar132 +
                                 fVar139 * fVar33 + fVar111 * fStack_1f4 + fVar121 * fStack_314;
                  pfVar2[0x16] = fVar108 * auVar61._24_4_ + fVar137 * fStack_2b0 +
                                 fVar103 * fVar39 + fVar107 * fStack_170 +
                                 fVar110 * fVar27 + fVar115 * fStack_e0 + fVar133 +
                                 fVar139 * fVar34 + fVar111 * fStack_1f0 + fVar121 * fStack_310;
                  pfVar2[0x17] = fVar141 + fVar103 + fStack_16c + fVar110 + fVar115 + fVar117 +
                                 fVar141 + fVar110 + fVar110 + fVar115;
                  fVar103 = *(float *)((long)pvVar84 + lVar81 + 0x14);
                  fVar115 = *(float *)((long)pvVar82 + lVar81 + 0x14);
                  fVar143 = fVar141 + fVar143;
                  fVar142 = fVar110 + fVar141;
                  fVar140 = *(float *)((long)pvVar74 + lVar81 + 0x14);
                  fVar127 = fVar103 * local_b8 + fVar115 * local_268 + fVar140 * fVar20;
                  fVar131 = fVar103 * fStack_b4 + fVar115 * fStack_264 + fVar140 * fVar21;
                  fVar132 = fVar103 * fStack_b0 + fVar115 * fStack_260 + fVar140 * fVar22;
                  fVar133 = fVar103 * fStack_ac + fVar115 * fStack_25c + fVar140 * fVar23;
                  fVar117 = fVar103 * fStack_a8 + fVar115 * fStack_258 + fVar140 * fVar24;
                  fVar114 = fVar103 * fStack_a4 + fVar115 * fStack_254 + fVar140 * fVar25;
                  fVar123 = fVar103 * fStack_a0 + fVar115 * fStack_250 + fVar140 * fVar26;
                  fVar134 = fVar141 + fVar143 + fVar142;
                  auVar129 = ZEXT3264(CONCAT428(fVar134,CONCAT424(fVar123,CONCAT420(fVar114,
                                                  CONCAT416(fVar117,CONCAT412(fVar133,CONCAT48(
                                                  fVar132,CONCAT44(fVar131,fVar127))))))));
                  fVar109 = fVar113 + fVar110;
                  fVar107 = fVar110 + fStack_9c + fVar109;
                  auVar99._0_4_ =
                       fVar108 * local_188 + fVar110 * fVar97 +
                       fVar137 * local_f8 + fVar111 * fVar92 +
                       fVar121 * auVar61._0_4_ + fVar139 * local_2c8 + fVar103 * fVar126 +
                       pfVar2[0x18] + fVar115 * local_328 + fVar140 * fVar28;
                  auVar99._4_4_ =
                       fVar108 * fStack_184 + fVar110 * fVar36 +
                       fVar137 * fStack_f4 + fVar111 * fVar98 +
                       fVar121 * auVar61._4_4_ + fVar139 * fStack_2c4 + fVar103 * fStack_204 +
                       pfVar2[0x19] + fVar115 * fStack_324 + fVar140 * fVar29;
                  auVar99._8_4_ =
                       fVar108 * fStack_180 + fVar110 * fVar120 +
                       fVar137 * fStack_f0 + fVar111 * fVar144 +
                       fVar121 * auVar61._8_4_ + fVar139 * fStack_2c0 + fVar103 * fStack_200 +
                       pfVar2[0x1a] + fVar115 * fStack_320 + fVar140 * fVar30;
                  auVar99._12_4_ =
                       fVar108 * fStack_17c + fVar110 * fVar37 +
                       fVar137 * fStack_ec + fVar111 * fVar119 +
                       fVar121 * auVar61._12_4_ + fVar139 * fStack_2bc + fVar103 * fStack_1fc +
                       pfVar2[0x1b] + fVar115 * fStack_31c + fVar140 * fVar31;
                  auVar99._16_4_ =
                       fVar108 * fStack_178 + fVar110 * fVar122 +
                       fVar137 * fStack_e8 + fVar111 * fVar94 +
                       fVar121 * auVar61._16_4_ + fVar139 * fStack_2b8 + fVar103 * fStack_1f8 +
                       pfVar2[0x1c] + fVar115 * fStack_318 + fVar140 * fVar32;
                  auVar99._20_4_ =
                       fVar108 * fStack_174 + fVar110 * fVar38 +
                       fVar137 * fStack_e4 + fVar111 * fVar96 +
                       fVar121 * auVar61._20_4_ + fVar139 * fStack_2b4 + fVar103 * fStack_1f4 +
                       pfVar2[0x1d] + fVar115 * fStack_314 + fVar140 * fVar33;
                  auVar99._24_4_ =
                       fVar108 * fStack_170 + fVar110 * fVar39 +
                       fVar137 * fStack_e0 + fVar111 * fVar27 +
                       fVar121 * auVar61._24_4_ + fVar139 * fStack_2b0 + fVar103 * fStack_1f0 +
                       pfVar2[0x1e] + fVar115 * fStack_310 + fVar140 * fVar34;
                  auVar99._28_4_ =
                       fVar107 + fVar109 + fVar139 + fVar103 + pfVar2[0x1f] + fVar103 + fVar107;
                  pfVar1[0x18] = fVar127 + fVar108 * local_248 + fVar110 * local_2a8 +
                                           fVar137 * fVar91 + fVar111 * local_d8 +
                                           fVar121 * local_228 + fVar139 * fVar13 + pfVar1[0x18];
                  pfVar1[0x19] = fVar131 + fVar108 * fStack_244 + fVar110 * fStack_2a4 +
                                           fVar137 * fVar106 + fVar111 * fStack_d4 +
                                           fVar121 * fStack_224 + fVar139 * fVar14 + pfVar1[0x19];
                  pfVar1[0x1a] = fVar132 + fVar108 * fStack_240 + fVar110 * fStack_2a0 +
                                           fVar137 * fVar90 + fVar111 * fStack_d0 +
                                           fVar121 * fStack_220 + fVar139 * fVar15 + pfVar1[0x1a];
                  pfVar1[0x1b] = fVar133 + fVar108 * fStack_23c + fVar110 * fStack_29c +
                                           fVar137 * fVar93 + fVar111 * fStack_cc +
                                           fVar121 * fStack_21c + fVar139 * fVar16 + pfVar1[0x1b];
                  pfVar1[0x1c] = fVar117 + fVar108 * fStack_238 + fVar110 * fStack_298 +
                                           fVar137 * fVar10 + fVar111 * fStack_c8 +
                                           fVar121 * fStack_218 + fVar139 * fVar17 + pfVar1[0x1c];
                  pfVar1[0x1d] = fVar114 + fVar108 * fStack_234 + fVar110 * fStack_294 +
                                           fVar137 * fVar11 + fVar111 * fStack_c4 +
                                           fVar121 * fStack_214 + fVar139 * fVar18 + pfVar1[0x1d];
                  pfVar1[0x1e] = fVar123 + fVar108 * fStack_230 + fVar110 * fStack_290 +
                                           fVar137 * fVar12 + fVar111 * fStack_c0 +
                                           fVar121 * fStack_210 + fVar139 * fVar19 + pfVar1[0x1e];
                  pfVar1[0x1f] = fVar134 + fVar141 + fVar112 + fVar143 + fVar142 + pfVar1[0x1f];
                  *(undefined1 (*) [32])(pfVar2 + 0x18) = auVar99;
                  lVar81 = lVar81 + 0x10;
                  iVar73 = iVar73 + 4;
                  pauVar63 = (undefined1 (*) [32])(pfVar2 + 0x20);
                  pauVar64 = (undefined1 (*) [32])(pfVar1 + 0x20);
                } while (iVar73 < (int)uVar6);
                pauVar85 = pauVar72 + 4;
                pauVar77 = pauVar69 + 4;
                pvVar84 = (void *)((long)pvVar84 + lVar81);
                pvVar82 = (void *)((long)pvVar82 + lVar81);
                pvVar74 = (void *)((long)pvVar74 + lVar81);
                auVar116 = ZEXT3264(auVar87);
                auVar129 = ZEXT3264(auVar88);
                uVar66 = uVar6 & 0xfffffffc;
              }
              if ((int)(uVar66 | 1) < (int)uVar6) {
                lVar81 = 0;
                pauVar63 = pauVar85;
                pauVar64 = pauVar77;
                uVar65 = uVar66;
                fVar110 = fVar142;
                do {
                  pauVar72 = pauVar64;
                  pauVar69 = pauVar63;
                  fVar111 = *(float *)((long)pvVar84 + lVar81);
                  fVar103 = *(float *)((long)pvVar84 + lVar81 + 4);
                  fVar115 = *(float *)((long)pvVar84 + lVar81 + 8);
                  fVar108 = *(float *)((long)pvVar82 + lVar81);
                  fVar121 = *(float *)((long)pvVar82 + lVar81 + 4);
                  fVar107 = *(float *)((long)pvVar82 + lVar81 + 8);
                  fVar137 = *(float *)((long)pvVar74 + lVar81);
                  fVar139 = *(float *)((long)pvVar74 + lVar81 + 4);
                  fVar142 = *(float *)((long)pvVar74 + lVar81 + 8);
                  fStack_28c = (float)((ulong)uVar46 >> 0x20);
                  pauVar63 = (undefined1 (*) [32])((long)pauVar85[2] + lVar81 * 2 * 4);
                  fVar109 = *(float *)((long)pauVar63[-2] + 4);
                  fVar127 = *(float *)((long)pauVar63[-2] + 8);
                  fVar131 = *(float *)((long)pauVar63[-2] + 0xc);
                  fVar132 = *(float *)((long)pauVar63[-2] + 0x10);
                  fVar133 = *(float *)((long)pauVar63[-2] + 0x14);
                  fVar117 = *(float *)((long)pauVar63[-2] + 0x18);
                  pauVar64 = (undefined1 (*) [32])((long)pauVar77[2] + lVar81 * 2 * 4);
                  fVar136 = auVar129._28_4_ + *(float *)((long)pauVar63[-2] + 0x1c) + fVar140 +
                            fVar140 + fVar140;
                  fVar112 = *(float *)pauVar64[-2];
                  fVar114 = *(float *)((long)pauVar64[-2] + 4);
                  fVar123 = *(float *)((long)pauVar64[-2] + 8);
                  fVar134 = *(float *)((long)pauVar64[-2] + 0xc);
                  fVar135 = *(float *)((long)pauVar64[-2] + 0x10);
                  fVar143 = *(float *)((long)pauVar64[-2] + 0x14);
                  fVar141 = *(float *)((long)pauVar64[-2] + 0x18);
                  in_ZMM1 = ZEXT3264(CONCAT428(fStack_9c,
                                               CONCAT424(fStack_a0,
                                                         CONCAT420(fStack_a4,
                                                                   CONCAT416(fStack_a8,
                                                                             CONCAT412(fStack_ac,
                                                                                       auVar59))))))
                  ;
                  fStack_28c = fVar140 + fStack_28c;
                  fVar124 = fVar111 + *(float *)((long)pauVar64[-2] + 0x1c) + fStack_28c;
                  fVar118 = fStack_28c + fVar108 + fStack_28c + fVar124;
                  fVar125 = fVar136 + fVar110 + fVar140 + fVar140 + fVar140 + fVar140;
                  fVar124 = fVar124 + fVar137 + fVar136 + fVar118;
                  *(float *)pauVar63[-2] =
                       fVar111 * local_2a8 + *(float *)pauVar63[-2] + fVar121 * local_228 +
                       fVar137 * fVar91 + fVar142 * fVar20 +
                       local_d8 * fVar103 + fVar115 * auVar59._0_4_ + fVar108 * local_248 +
                       fVar107 * local_268 + fVar139 * fVar13;
                  *(float *)((long)pauVar63[-2] + 4) =
                       fVar111 * fStack_2a4 + fVar109 + fVar121 * fStack_224 + fVar137 * fVar106 +
                       fVar142 * fVar21 +
                       fStack_d4 * fVar103 + fVar115 * auVar59._4_4_ + fVar108 * fStack_244 +
                       fVar107 * fStack_264 + fVar139 * fVar14;
                  *(float *)((long)pauVar63[-2] + 8) =
                       fVar111 * fStack_2a0 + fVar127 + fVar121 * fStack_220 + fVar137 * fVar90 +
                       fVar142 * fVar22 +
                       fStack_d0 * fVar103 + fVar115 * auVar59._8_4_ + fVar108 * fStack_240 +
                       fVar107 * fStack_260 + fVar139 * fVar15;
                  *(float *)((long)pauVar63[-2] + 0xc) =
                       fVar111 * fStack_29c + fVar131 + fVar121 * fStack_21c + fVar137 * fVar93 +
                       fVar142 * fVar23 +
                       fStack_cc * fVar103 + fVar115 * fStack_ac + fVar108 * fStack_23c +
                       fVar107 * fStack_25c + fVar139 * fVar16;
                  *(float *)((long)pauVar63[-2] + 0x10) =
                       fVar111 * fStack_298 + fVar132 + fVar121 * fStack_218 + fVar137 * fVar10 +
                       fVar142 * fVar24 +
                       fStack_c8 * fVar103 + fVar115 * fStack_a8 + fVar108 * fStack_238 +
                       fVar107 * fStack_258 + fVar139 * fVar17;
                  *(float *)((long)pauVar63[-2] + 0x14) =
                       fVar111 * fStack_294 + fVar133 + fVar121 * fStack_214 + fVar137 * fVar11 +
                       fVar142 * fVar25 +
                       fStack_c4 * fVar103 + fVar115 * fStack_a4 + fVar108 * fStack_234 +
                       fVar107 * fStack_254 + fVar139 * fVar18;
                  *(float *)((long)pauVar63[-2] + 0x18) =
                       fVar111 * fStack_290 + fVar117 + fVar121 * fStack_210 + fVar137 * fVar12 +
                       fVar142 * fVar26 +
                       fStack_c0 * fVar103 + fVar115 * fStack_a0 + fVar108 * fStack_230 +
                       fVar107 * fStack_250 + fVar139 * fVar19;
                  *(float *)((long)pauVar63[-2] + 0x1c) = fVar125;
                  *(float *)pauVar64[-2] =
                       fVar111 * fVar97 + fVar112 + fVar121 * fVar138 + fVar137 * local_f8 +
                       fVar142 * fVar28 +
                       fVar103 * fVar92 + fVar115 * fVar126 + fVar108 * local_188 +
                       fVar107 * local_328 + fVar139 * local_2c8;
                  *(float *)((long)pauVar64[-2] + 4) =
                       fVar111 * fVar36 + fVar114 + fVar121 * fVar40 + fVar137 * fStack_f4 +
                       fVar142 * fVar29 +
                       fVar103 * fVar98 + fVar115 * fStack_204 + fVar108 * fStack_184 +
                       fVar107 * fStack_324 + fVar139 * fStack_2c4;
                  *(float *)((long)pauVar64[-2] + 8) =
                       fVar111 * fVar120 + fVar123 + fVar121 * fVar95 + fVar137 * fStack_f0 +
                       fVar142 * fVar30 +
                       fVar103 * fVar144 + fVar115 * fStack_200 + fVar108 * fStack_180 +
                       fVar107 * fStack_320 + fVar139 * fStack_2c0;
                  *(float *)((long)pauVar64[-2] + 0xc) =
                       fVar111 * fVar37 + fVar134 + fVar121 * fVar41 + fVar137 * fStack_ec +
                       fVar142 * fVar31 +
                       fVar103 * fVar119 + fVar115 * fStack_1fc + fVar108 * fStack_17c +
                       fVar107 * fStack_31c + fVar139 * fStack_2bc;
                  *(float *)((long)pauVar64[-2] + 0x10) =
                       fVar111 * fVar122 + fVar135 + fVar121 * fVar102 + fVar137 * fStack_e8 +
                       fVar142 * fVar32 +
                       fVar103 * fVar94 + fVar115 * fStack_1f8 + fVar108 * fStack_178 +
                       fVar107 * fStack_318 + fVar139 * fStack_2b8;
                  *(float *)((long)pauVar64[-2] + 0x14) =
                       fVar111 * fVar38 + fVar143 + fVar121 * fVar42 + fVar137 * fStack_e4 +
                       fVar142 * fVar33 +
                       fVar103 * fVar96 + fVar115 * fStack_1f4 + fVar108 * fStack_174 +
                       fVar107 * fStack_314 + fVar139 * fStack_2b4;
                  *(float *)((long)pauVar64[-2] + 0x18) =
                       fVar111 * fVar39 + fVar141 + fVar121 * fVar105 + fVar137 * fStack_e0 +
                       fVar142 * fVar34 +
                       fVar103 * fVar27 + fVar115 * fStack_1f0 + fVar108 * fStack_170 +
                       fVar107 * fStack_310 + fVar139 * fStack_2b0;
                  *(float *)((long)pauVar64[-2] + 0x1c) = fVar124;
                  fVar140 = *(float *)((long)pvVar84 + lVar81 + 0xc);
                  fVar110 = *(float *)((long)pvVar82 + lVar81 + 0xc);
                  auVar129 = ZEXT3264(auVar88);
                  fVar111 = *(float *)((long)pvVar74 + lVar81 + 0xc);
                  fVar108 = fVar118 + fVar124 + fVar118 + fVar125 + fVar125 +
                            *(float *)((long)pauVar63[-1] + 0x1c);
                  auVar104._0_4_ =
                       local_d8 * fVar115 + local_2a8 * fVar103 +
                       fVar121 * local_248 + fVar107 * local_228 + fVar139 * fVar91 +
                       *(float *)pauVar63[-1] +
                       fVar142 * fVar13 + fVar140 * auVar59._0_4_ + fVar110 * local_268 +
                       fVar111 * fVar20;
                  auVar104._4_4_ =
                       fStack_d4 * fVar115 + fStack_2a4 * fVar103 +
                       fVar121 * fStack_244 + fVar107 * fStack_224 + fVar139 * fVar106 +
                       *(float *)((long)pauVar63[-1] + 4) +
                       fVar142 * fVar14 + fVar140 * auVar59._4_4_ + fVar110 * fStack_264 +
                       fVar111 * fVar21;
                  auVar104._8_4_ =
                       fStack_d0 * fVar115 + fStack_2a0 * fVar103 +
                       fVar121 * fStack_240 + fVar107 * fStack_220 + fVar139 * fVar90 +
                       *(float *)((long)pauVar63[-1] + 8) +
                       fVar142 * fVar15 + fVar140 * auVar59._8_4_ + fVar110 * fStack_260 +
                       fVar111 * fVar22;
                  auVar104._12_4_ =
                       fStack_cc * fVar115 + fStack_29c * fVar103 +
                       fVar121 * fStack_23c + fVar107 * fStack_21c + fVar139 * fVar93 +
                       *(float *)((long)pauVar63[-1] + 0xc) +
                       fVar142 * fVar16 + fVar140 * fStack_ac + fVar110 * fStack_25c +
                       fVar111 * fVar23;
                  auVar104._16_4_ =
                       fStack_c8 * fVar115 + fStack_298 * fVar103 +
                       fVar121 * fStack_238 + fVar107 * fStack_218 + fVar139 * fVar10 +
                       *(float *)((long)pauVar63[-1] + 0x10) +
                       fVar142 * fVar17 + fVar140 * fStack_a8 + fVar110 * fStack_258 +
                       fVar111 * fVar24;
                  auVar104._20_4_ =
                       fStack_c4 * fVar115 + fStack_294 * fVar103 +
                       fVar121 * fStack_234 + fVar107 * fStack_214 + fVar139 * fVar11 +
                       *(float *)((long)pauVar63[-1] + 0x14) +
                       fVar142 * fVar18 + fVar140 * fStack_a4 + fVar110 * fStack_254 +
                       fVar111 * fVar25;
                  auVar104._24_4_ =
                       fStack_c0 * fVar115 + fStack_290 * fVar103 +
                       fVar121 * fStack_230 + fVar107 * fStack_210 + fVar139 * fVar12 +
                       *(float *)((long)pauVar63[-1] + 0x18) +
                       fVar142 * fVar19 + fVar140 * fStack_a0 + fVar110 * fStack_250 +
                       fVar111 * fVar26;
                  auVar104._28_4_ = fVar108 + fVar125 + fVar142 + fVar142 + fVar142;
                  auVar100._0_4_ =
                       fVar115 * fVar92 + fVar103 * fVar97 + fVar121 * local_188 + fVar107 * fVar138
                       + local_f8 * fVar139 + fVar142 * local_2c8 + *(float *)pauVar64[-1] +
                       fVar140 * fVar126 + fVar110 * local_328 + fVar111 * fVar28;
                  auVar100._4_4_ =
                       fVar115 * fVar98 + fVar103 * fVar36 + fVar121 * fStack_184 + fVar107 * fVar40
                       + fStack_f4 * fVar139 + fVar142 * fStack_2c4 +
                       *(float *)((long)pauVar64[-1] + 4) +
                       fVar140 * fStack_204 + fVar110 * fStack_324 + fVar111 * fVar29;
                  auVar100._8_4_ =
                       fVar115 * fVar144 + fVar103 * fVar120 +
                       fVar121 * fStack_180 + fVar107 * fVar95 +
                       fStack_f0 * fVar139 + fVar142 * fStack_2c0 +
                       *(float *)((long)pauVar64[-1] + 8) +
                       fVar140 * fStack_200 + fVar110 * fStack_320 + fVar111 * fVar30;
                  auVar100._12_4_ =
                       fVar115 * fVar119 + fVar103 * fVar37 +
                       fVar121 * fStack_17c + fVar107 * fVar41 +
                       fStack_ec * fVar139 + fVar142 * fStack_2bc +
                       *(float *)((long)pauVar64[-1] + 0xc) +
                       fVar140 * fStack_1fc + fVar110 * fStack_31c + fVar111 * fVar31;
                  auVar100._16_4_ =
                       fVar115 * fVar94 + fVar103 * fVar122 +
                       fVar121 * fStack_178 + fVar107 * fVar102 +
                       fStack_e8 * fVar139 + fVar142 * fStack_2b8 +
                       *(float *)((long)pauVar64[-1] + 0x10) +
                       fVar140 * fStack_1f8 + fVar110 * fStack_318 + fVar111 * fVar32;
                  auVar100._20_4_ =
                       fVar115 * fVar96 + fVar103 * fVar38 + fVar121 * fStack_174 + fVar107 * fVar42
                       + fStack_e4 * fVar139 + fVar142 * fStack_2b4 +
                       *(float *)((long)pauVar64[-1] + 0x14) +
                       fVar140 * fStack_1f4 + fVar110 * fStack_314 + fVar111 * fVar33;
                  auVar100._24_4_ =
                       fVar115 * fVar27 + fVar103 * fVar39 +
                       fVar121 * fStack_170 + fVar107 * fVar105 +
                       fStack_e0 * fVar139 + fVar142 * fStack_2b0 +
                       *(float *)((long)pauVar64[-1] + 0x18) +
                       fVar140 * fStack_1f0 + fVar110 * fStack_310 + fVar111 * fVar34;
                  auVar100._28_4_ =
                       fVar115 + fVar103 + fVar121 + fVar107 + fVar139 + fVar142 +
                       *(float *)((long)pauVar64[-1] + 0x1c) + fVar107 + fVar115 + fVar103 + fVar108
                  ;
                  pauVar63[-1] = auVar104;
                  pauVar64[-1] = auVar100;
                  uVar66 = uVar65 + 2;
                  lVar81 = lVar81 + 8;
                  iVar73 = uVar65 + 3;
                  uVar65 = uVar66;
                  fVar110 = fVar142;
                  fVar140 = fVar35;
                } while (iVar73 < (int)uVar6);
                pauVar85 = pauVar69 + 2;
                pauVar77 = pauVar72 + 2;
                pvVar84 = (void *)((long)pvVar84 + lVar81);
                pvVar82 = (void *)((long)pvVar82 + lVar81);
                pvVar74 = (void *)((long)pvVar74 + lVar81);
                auVar116 = ZEXT3264(auVar87);
              }
              iVar73 = uVar6 - uVar66;
              if (iVar73 != 0 && (int)uVar66 <= (int)uVar6) {
                lVar81 = 0;
                lVar68 = 0;
                in_ZMM1 = ZEXT3264(auVar129._0_32_);
                auVar130 = auVar129;
                do {
                  fVar110 = *(float *)((long)pvVar84 + lVar81);
                  fVar111 = *(float *)((long)pvVar84 + lVar81 + 4);
                  fVar103 = *(float *)((long)pvVar84 + lVar81 + 8);
                  fVar108 = *(float *)((long)pvVar82 + lVar81);
                  fVar121 = *(float *)((long)pvVar82 + lVar81 + 4);
                  fVar107 = *(float *)((long)pvVar82 + lVar81 + 8);
                  fVar137 = *(float *)((long)pvVar74 + lVar81);
                  fVar139 = *(float *)((long)pvVar74 + lVar81 + 4);
                  fVar109 = *(float *)((long)pvVar74 + lVar81 + 8);
                  pfVar1 = (float *)((long)*pauVar85 + lVar81 * 2 * 4);
                  fVar142 = fVar142 + fVar140 + fVar140 + fVar140 + fVar140;
                  auVar128._0_4_ =
                       fVar110 * local_2a8 + *pfVar1 + fVar121 * local_228 + fVar137 * fVar91 +
                       fVar109 * fVar20 +
                       fVar111 * local_d8 + fVar103 * local_b8 + fVar108 * local_248 +
                       fVar107 * local_268 + fVar139 * fVar13;
                  auVar128._4_4_ =
                       fVar110 * fStack_2a4 + pfVar1[1] + fVar121 * fStack_224 + fVar137 * fVar106 +
                       fVar109 * fVar21 +
                       fVar111 * fStack_d4 + fVar103 * fStack_b4 + fVar108 * fStack_244 +
                       fVar107 * fStack_264 + fVar139 * fVar14;
                  auVar128._8_4_ =
                       fVar110 * fStack_2a0 + pfVar1[2] + fVar121 * fStack_220 + fVar137 * fVar90 +
                       fVar109 * fVar22 +
                       fVar111 * fStack_d0 + fVar103 * fStack_b0 + fVar108 * fStack_240 +
                       fVar107 * fStack_260 + fVar139 * fVar15;
                  auVar128._12_4_ =
                       fVar110 * fStack_29c + pfVar1[3] + fVar121 * fStack_21c + fVar137 * fVar93 +
                       fVar109 * fVar23 +
                       fVar111 * fStack_cc + fVar103 * fStack_ac + fVar108 * fStack_23c +
                       fVar107 * fStack_25c + fVar139 * fVar16;
                  auVar128._16_4_ =
                       fVar110 * fStack_298 + pfVar1[4] + fVar121 * fStack_218 + fVar137 * fVar10 +
                       fVar109 * fVar24 +
                       fVar111 * fStack_c8 + fVar103 * fStack_a8 + fVar108 * fStack_238 +
                       fVar107 * fStack_258 + fVar139 * fVar17;
                  auVar128._20_4_ =
                       fVar110 * fStack_294 + pfVar1[5] + fVar121 * fStack_214 + fVar137 * fVar11 +
                       fVar109 * fVar25 +
                       fVar111 * fStack_c4 + fVar103 * fStack_a4 + fVar108 * fStack_234 +
                       fVar107 * fStack_254 + fVar139 * fVar18;
                  auVar128._24_4_ =
                       fVar110 * fStack_290 + pfVar1[6] + fVar121 * fStack_210 + fVar137 * fVar12 +
                       fVar109 * fVar26 +
                       fVar111 * fStack_c0 + fVar103 * fStack_a0 + fVar108 * fStack_230 +
                       fVar107 * fStack_250 + fVar139 * fVar19;
                  auVar128._28_4_ =
                       auVar130._28_4_ + pfVar1[7] + fVar140 + fVar140 + fVar140 + fVar142;
                  auVar130 = ZEXT3264(auVar128);
                  fVar115 = fVar103 + fVar103 + fVar111;
                  pfVar1 = (float *)((long)*pauVar77 + lVar81 * 2 * 4);
                  auVar101._0_4_ =
                       fVar121 * fVar138 + fVar97 * fVar110 + *pfVar1 + fVar137 * auVar129._0_4_ +
                       fVar109 * fVar28 +
                       fVar108 * auVar116._0_4_ + fVar103 * fVar126 + fVar111 * fVar92 +
                       fVar107 * local_328 + fVar139 * local_2c8;
                  auVar101._4_4_ =
                       fVar121 * fVar40 + fVar36 * fVar110 + pfVar1[1] + fVar137 * auVar129._4_4_ +
                       fVar109 * fVar29 +
                       fVar108 * auVar116._4_4_ + fVar103 * fStack_204 + fVar111 * fVar98 +
                       fVar107 * fStack_324 + fVar139 * fStack_2c4;
                  auVar101._8_4_ =
                       fVar121 * fVar95 + fVar120 * fVar110 + pfVar1[2] + fVar137 * auVar129._8_4_ +
                       fVar109 * fVar30 +
                       fVar108 * auVar116._8_4_ + fVar103 * fStack_200 + fVar111 * fVar144 +
                       fVar107 * fStack_320 + fVar139 * fStack_2c0;
                  auVar101._12_4_ =
                       fVar121 * fVar41 + fVar37 * fVar110 + pfVar1[3] + fVar137 * auVar129._12_4_ +
                       fVar109 * fVar31 +
                       fVar108 * auVar116._12_4_ + fVar103 * fStack_1fc + fVar111 * fVar119 +
                       fVar107 * fStack_31c + fVar139 * fStack_2bc;
                  auVar101._16_4_ =
                       fVar121 * fVar102 + fVar122 * fVar110 + pfVar1[4] + fVar137 * auVar129._16_4_
                       + fVar109 * fVar32 +
                       fVar108 * auVar116._16_4_ + fVar103 * fStack_1f8 + fVar111 * fVar94 +
                       fVar107 * fStack_318 + fVar139 * fStack_2b8;
                  auVar101._20_4_ =
                       fVar121 * fVar42 + fVar38 * fVar110 + pfVar1[5] + fVar137 * auVar129._20_4_ +
                       fVar109 * fVar33 +
                       fVar108 * auVar116._20_4_ + fVar103 * fStack_1f4 + fVar111 * fVar96 +
                       fVar107 * fStack_314 + fVar139 * fStack_2b4;
                  auVar101._24_4_ =
                       fVar121 * fVar105 + fVar39 * fVar110 + pfVar1[6] + fVar137 * auVar129._24_4_
                       + fVar109 * fVar34 +
                       fVar108 * auVar116._24_4_ + fVar103 * fStack_1f0 + fVar111 * fVar27 +
                       fVar107 * fStack_310 + fVar139 * fStack_2b0;
                  auVar101._28_4_ =
                       fVar103 + fVar110 + pfVar1[7] + fVar137 + fVar109 +
                       fVar115 + fVar107 + fVar139;
                  *(undefined1 (*) [32])((long)*pauVar85 + lVar81 * 2 * 4) = auVar128;
                  *(undefined1 (*) [32])((long)*pauVar77 + lVar81 * 2 * 4) = auVar101;
                  lVar68 = lVar68 + -0x20;
                  lVar81 = lVar81 + 4;
                  iVar73 = iVar73 + -1;
                  fVar140 = fVar35;
                } while (iVar73 != 0);
                pauVar85 = (undefined1 (*) [32])((long)pauVar85 - lVar68);
                pauVar77 = (undefined1 (*) [32])((long)pauVar77 - lVar68);
                pvVar84 = (void *)((long)pvVar84 + lVar81);
                pvVar82 = (void *)((long)pvVar82 + lVar81);
                pvVar74 = (void *)((long)pvVar74 + lVar81);
                auVar116 = ZEXT3264(auVar116._0_32_);
                auVar129 = ZEXT3264(auVar129._0_32_);
              }
              pvVar84 = (void *)((long)pvVar84 + 8);
              pvVar82 = (void *)((long)pvVar82 + 8);
              pvVar74 = (void *)((long)pvVar74 + 8);
              iVar70 = iVar70 + 1;
            } while (iVar70 != iVar7);
          }
          local_1b8 = local_1b8 + 0x24;
          pfVar79 = pfVar79 + 0x48;
          local_338 = local_338 + 1;
        } while (local_338 != uVar5);
      }
      uVar78 = uVar78 + 1;
    } while (uVar78 != (uint)(iVar8 >> 1));
  }
  if ((int)uVar83 != iVar8) {
    do {
      uVar80 = (long)top_blob->h * (long)top_blob->w;
      uVar78 = top_blob->elemsize;
      uVar67 = (uVar78 * uVar80 + 0xf & 0xfffffffffffffff0) / uVar78;
      if (top_blob->dims == 4) {
        uVar67 = uVar80;
      }
      if (pvVar9 == (void *)0x0) {
        auVar86 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar86 = *(undefined1 (*) [32])((long)pvVar9 + uVar83 * 0x20);
      }
      pauVar76 = (undefined1 (*) [32])(top_blob->cstep * uVar83 * uVar78 + (long)top_blob->data);
      iVar70 = (int)uVar67 * top_blob->d;
      pauVar71 = pauVar76;
      if (0 < iVar70) {
        do {
          *pauVar71 = auVar86;
          iVar70 = iVar70 + -1;
          pauVar71 = pauVar71 + 1;
        } while (iVar70 != 0);
      }
      if (0 < (int)uVar5) {
        pfVar79 = (float *)(kernel->cstep * uVar83 * kernel->elemsize + (long)kernel->data);
        uVar78 = 0;
        do {
          if (0 < iVar7) {
            fVar35 = *pfVar79;
            fVar97 = pfVar79[1];
            uVar50 = *(undefined8 *)pfVar79;
            fVar36 = pfVar79[2];
            fVar120 = pfVar79[3];
            uVar51 = *(undefined8 *)(pfVar79 + 2);
            fVar37 = pfVar79[4];
            fVar122 = pfVar79[5];
            uVar52 = *(undefined8 *)(pfVar79 + 4);
            fVar38 = pfVar79[6];
            uVar53 = *(undefined8 *)(pfVar79 + 6);
            fVar11 = pfVar79[8];
            fVar12 = pfVar79[9];
            fVar13 = pfVar79[10];
            fVar14 = pfVar79[0xb];
            fVar15 = pfVar79[0xc];
            fVar16 = pfVar79[0xd];
            fVar17 = pfVar79[0xe];
            fVar18 = pfVar79[0xf];
            local_228 = *(float *)*(undefined1 (*) [28])(pfVar79 + 0x10);
            fStack_224 = pfVar79[0x11];
            fStack_220 = pfVar79[0x12];
            fStack_21c = pfVar79[0x13];
            fStack_218 = pfVar79[0x14];
            fStack_214 = pfVar79[0x15];
            fStack_210 = pfVar79[0x16];
            auVar61 = *(undefined1 (*) [28])(pfVar79 + 0x10);
            pauVar71 = (undefined1 (*) [32])(pfVar79 + 0x18);
            fVar115 = *(float *)*pauVar71;
            fVar140 = pfVar79[0x19];
            fVar142 = pfVar79[0x1a];
            fVar91 = pfVar79[0x1b];
            fVar106 = pfVar79[0x1c];
            fVar90 = pfVar79[0x1d];
            fVar93 = pfVar79[0x1e];
            auVar60 = *(undefined1 (*) [28])*pauVar71;
            fVar10 = pfVar79[0x1f];
            auVar3 = *pauVar71;
            fVar19 = pfVar79[0x20];
            fVar20 = pfVar79[0x21];
            uVar43 = *(undefined8 *)(pfVar79 + 0x20);
            fVar21 = pfVar79[0x22];
            fVar22 = pfVar79[0x23];
            uVar44 = *(undefined8 *)(pfVar79 + 0x22);
            fVar23 = pfVar79[0x24];
            fVar24 = pfVar79[0x25];
            uVar45 = *(undefined8 *)(pfVar79 + 0x24);
            fVar25 = pfVar79[0x26];
            fVar26 = pfVar79[0x27];
            uVar46 = *(undefined8 *)(pfVar79 + 0x26);
            auVar86 = *(undefined1 (*) [32])(pfVar79 + 0x28);
            auVar116 = ZEXT3264(auVar86);
            pauVar71 = (undefined1 (*) [32])(pfVar79 + 0x30);
            fVar113 = *(float *)*pauVar71;
            fVar92 = pfVar79[0x31];
            fVar98 = pfVar79[0x32];
            fVar144 = pfVar79[0x33];
            fVar119 = pfVar79[0x34];
            fVar94 = pfVar79[0x35];
            fVar96 = pfVar79[0x36];
            auVar62 = *(undefined1 (*) [28])*pauVar71;
            fVar27 = pfVar79[0x37];
            auVar4 = *pauVar71;
            fVar28 = pfVar79[0x38];
            fVar29 = pfVar79[0x39];
            fVar30 = pfVar79[0x3a];
            fVar31 = pfVar79[0x3b];
            fVar32 = pfVar79[0x3c];
            fVar33 = pfVar79[0x3d];
            fVar34 = pfVar79[0x3e];
            fVar39 = pfVar79[0x40];
            fVar138 = pfVar79[0x41];
            uVar47 = *(undefined8 *)(pfVar79 + 0x40);
            fVar40 = pfVar79[0x42];
            fVar95 = pfVar79[0x43];
            uVar48 = *(undefined8 *)(pfVar79 + 0x42);
            fVar41 = pfVar79[0x44];
            fVar102 = pfVar79[0x45];
            uVar49 = *(undefined8 *)(pfVar79 + 0x44);
            fVar42 = pfVar79[0x46];
            pvVar82 = (void *)(bottom_blob->cstep * uVar78 * bottom_blob->elemsize +
                              (long)bottom_blob->data);
            lVar81 = (long)bottom_blob->w * bottom_blob->elemsize;
            pvVar74 = (void *)((long)pvVar82 + lVar81 * 2);
            pvVar84 = (void *)(lVar81 + (long)pvVar82);
            iVar70 = 0;
            pauVar71 = pauVar76;
            fVar105 = fVar19;
            fVar126 = fVar21;
            fVar110 = fVar23;
            fVar111 = fVar25;
            fVar103 = fVar35;
            fVar108 = fVar36;
            fVar121 = fVar37;
            fVar107 = fVar38;
            fVar137 = fVar39;
            fVar139 = fVar40;
            fVar109 = fVar41;
            do {
              local_2a8 = (float)uVar50;
              fStack_2a4 = (float)((ulong)uVar50 >> 0x20);
              fStack_2a0 = (float)uVar51;
              fStack_29c = (float)((ulong)uVar51 >> 0x20);
              fStack_298 = (float)uVar52;
              fStack_294 = (float)((ulong)uVar52 >> 0x20);
              fStack_290 = (float)uVar53;
              fStack_28c = (float)((ulong)uVar53 >> 0x20);
              local_328 = (float)uVar43;
              fStack_320 = (float)uVar44;
              fStack_318 = (float)uVar45;
              fStack_244 = auVar4._4_4_;
              fStack_240 = auVar4._8_4_;
              fStack_23c = auVar4._12_4_;
              fStack_238 = auVar4._16_4_;
              fStack_234 = auVar4._20_4_;
              fStack_230 = auVar4._24_4_;
              local_2c8 = (float)uVar47;
              fStack_2c4 = (float)((ulong)uVar47 >> 0x20);
              fStack_2c0 = (float)uVar48;
              fStack_2bc = (float)((ulong)uVar48 >> 0x20);
              fStack_2b8 = (float)uVar49;
              fStack_2b4 = (float)((ulong)uVar49 >> 0x20);
              fStack_310 = (float)uVar46;
              local_268 = auVar3._0_4_;
              fStack_264 = auVar3._4_4_;
              fStack_260 = auVar3._8_4_;
              fStack_25c = auVar3._12_4_;
              fStack_258 = auVar3._16_4_;
              fStack_254 = auVar3._20_4_;
              fStack_250 = auVar3._24_4_;
              local_248 = auVar62._0_4_;
              if ((int)uVar6 < 4) {
                uVar66 = 0;
                pauVar77 = pauVar71;
              }
              else {
                iVar73 = 3;
                lVar81 = 0;
                pauVar77 = pauVar71;
                do {
                  pauVar85 = pauVar77;
                  fVar115 = *(float *)((long)pvVar82 + lVar81);
                  fVar140 = *(float *)((long)pvVar82 + lVar81 + 4);
                  fVar142 = *(float *)((long)pvVar82 + lVar81 + 8);
                  fVar91 = *(float *)((long)pvVar84 + lVar81);
                  fVar106 = *(float *)((long)pvVar84 + lVar81 + 4);
                  fVar90 = *(float *)((long)pvVar84 + lVar81 + 8);
                  fVar93 = *(float *)((long)pvVar74 + lVar81);
                  fVar113 = *(float *)((long)pvVar74 + lVar81 + 4);
                  fVar92 = *(float *)((long)pvVar74 + lVar81 + 8);
                  pfVar1 = (float *)((long)*pauVar71 + lVar81 * 2 * 4);
                  fVar119 = fVar115 + pfVar1[7];
                  local_228 = auVar61._0_4_;
                  fStack_224 = auVar61._4_4_;
                  fStack_220 = auVar61._8_4_;
                  fStack_21c = auVar61._12_4_;
                  fStack_218 = auVar61._16_4_;
                  fStack_214 = auVar61._20_4_;
                  fStack_210 = auVar61._24_4_;
                  fVar94 = auVar60._0_4_;
                  fVar96 = auVar60._4_4_;
                  fVar97 = auVar60._8_4_;
                  fVar120 = auVar60._12_4_;
                  fVar122 = auVar60._16_4_;
                  fVar138 = auVar60._20_4_;
                  fVar95 = auVar60._24_4_;
                  local_208 = auVar86._0_4_;
                  fStack_204 = auVar86._4_4_;
                  fStack_200 = auVar86._8_4_;
                  fStack_1fc = auVar86._12_4_;
                  fStack_1f8 = auVar86._16_4_;
                  fStack_1f4 = auVar86._20_4_;
                  fStack_1f0 = auVar86._24_4_;
                  fVar105 = fVar119 + fVar119 + fVar119 + fVar18;
                  fVar98 = *(float *)((long)pvVar82 + lVar81 + 0xc);
                  fVar144 = *(float *)((long)pvVar84 + lVar81 + 0xc);
                  fVar102 = fVar105 + fVar119 + fVar119 + fStack_28c + fVar18 + fVar18;
                  fVar119 = *(float *)((long)pvVar74 + lVar81 + 0xc);
                  *pfVar1 = fVar92 * fVar39 +
                            local_248 * fVar93 + fVar115 * fVar35 + *pfVar1 + fVar106 * fVar19 +
                            fVar113 * fVar28 +
                            fVar90 * local_208 +
                            fVar140 * fVar11 + fVar142 * local_228 + fVar91 * fVar94;
                  pfVar1[1] = fVar92 * fStack_2c4 +
                              fStack_244 * fVar93 +
                              fVar115 * fStack_2a4 + pfVar1[1] + fVar106 * fVar20 +
                              fVar113 * fVar29 +
                              fVar90 * fStack_204 +
                              fVar140 * fVar12 + fVar142 * fStack_224 + fVar91 * fVar96;
                  pfVar1[2] = fVar92 * fVar40 +
                              fStack_240 * fVar93 + fVar115 * fVar36 + pfVar1[2] + fVar106 * fVar21
                              + fVar113 * fVar30 +
                                fVar90 * fStack_200 +
                                fVar140 * fVar13 + fVar142 * fStack_220 + fVar91 * fVar97;
                  pfVar1[3] = fVar92 * fStack_2bc +
                              fStack_23c * fVar93 +
                              fVar115 * fStack_29c + pfVar1[3] + fVar106 * fVar22 +
                              fVar113 * fVar31 +
                              fVar90 * fStack_1fc +
                              fVar140 * fVar14 + fVar142 * fStack_21c + fVar91 * fVar120;
                  pfVar1[4] = fVar92 * fVar41 +
                              fStack_238 * fVar93 + fVar115 * fVar37 + pfVar1[4] + fVar106 * fVar23
                              + fVar113 * fVar32 +
                                fVar90 * fStack_1f8 +
                                fVar140 * fVar15 + fVar142 * fStack_218 + fVar91 * fVar122;
                  pfVar1[5] = fVar92 * fStack_2b4 +
                              fStack_234 * fVar93 +
                              fVar115 * fStack_294 + pfVar1[5] + fVar106 * fVar24 +
                              fVar113 * fVar33 +
                              fVar90 * fStack_1f4 +
                              fVar140 * fVar16 + fVar142 * fStack_214 + fVar91 * fVar138;
                  pfVar1[6] = fVar92 * fVar42 +
                              fStack_230 * fVar93 + fVar115 * fVar38 + pfVar1[6] + fVar106 * fVar25
                              + fVar113 * fVar34 +
                                fVar90 * fStack_1f0 +
                                fVar140 * fVar17 + fVar142 * fStack_210 + fVar91 * fVar95;
                  pfVar1[7] = fVar102;
                  fVar105 = fVar105 + fVar102;
                  fVar126 = fVar105 + fVar140 + fVar106;
                  fStack_1ec = auVar86._28_4_;
                  fVar102 = pfVar1[0xf];
                  fVar115 = *(float *)((long)pvVar82 + lVar81 + 0x10);
                  fVar91 = *(float *)((long)pvVar84 + lVar81 + 0x10);
                  fVar93 = *(float *)((long)pvVar74 + lVar81 + 0x10);
                  fVar105 = fVar126 + fVar102 + fVar140 + fVar144 + fVar10 + fVar105 + fVar105;
                  pfVar1[8] = fVar142 * fVar11 + fVar140 * fVar35 +
                              fVar90 * fVar19 + fVar94 * fVar106 + pfVar1[8] +
                              fVar92 * fVar28 + local_248 * fVar113 + fVar98 * local_228 +
                              fVar144 * local_208 + fVar119 * fVar39;
                  pfVar1[9] = fVar142 * fVar12 + fVar140 * fStack_2a4 +
                              fVar90 * fVar20 + fVar96 * fVar106 + pfVar1[9] +
                              fVar92 * fVar29 + fStack_244 * fVar113 + fVar98 * fStack_224 +
                              fVar144 * fStack_204 + fVar119 * fStack_2c4;
                  pfVar1[10] = fVar142 * fVar13 + fVar140 * fVar36 +
                               fVar90 * fVar21 + fVar97 * fVar106 + pfVar1[10] +
                               fVar92 * fVar30 + fStack_240 * fVar113 + fVar98 * fStack_220 +
                               fVar144 * fStack_200 + fVar119 * fVar40;
                  pfVar1[0xb] = fVar142 * fVar14 + fVar140 * fStack_29c +
                                fVar90 * fVar22 + fVar120 * fVar106 + pfVar1[0xb] +
                                fVar92 * fVar31 + fStack_23c * fVar113 + fVar98 * fStack_21c +
                                fVar144 * fStack_1fc + fVar119 * fStack_2bc;
                  pfVar1[0xc] = fVar142 * fVar15 + fVar140 * fVar37 +
                                fVar90 * fVar23 + fVar122 * fVar106 + pfVar1[0xc] +
                                fVar92 * fVar32 + fStack_238 * fVar113 + fVar98 * fStack_218 +
                                fVar144 * fStack_1f8 + fVar119 * fVar41;
                  pfVar1[0xd] = fVar142 * fVar16 + fVar140 * fStack_294 +
                                fVar90 * fVar24 + fVar138 * fVar106 + pfVar1[0xd] +
                                fVar92 * fVar33 + fStack_234 * fVar113 + fVar98 * fStack_214 +
                                fVar144 * fStack_1f4 + fVar119 * fStack_2b4;
                  pfVar1[0xe] = fVar142 * fVar17 + fVar140 * fVar38 +
                                fVar90 * fVar25 + fVar95 * fVar106 + pfVar1[0xe] +
                                fVar92 * fVar34 + fStack_230 * fVar113 + fVar98 * fStack_210 +
                                fVar144 * fStack_1f0 + fVar119 * fVar42;
                  pfVar1[0xf] = fVar105;
                  fVar140 = *(float *)((long)pvVar82 + lVar81 + 0x14);
                  fVar106 = *(float *)((long)pvVar84 + lVar81 + 0x14);
                  fVar102 = fVar142 + fVar105 + fVar126 + fVar126 + fVar102 + pfVar1[0x17] +
                            fVar126 + fVar126 + fVar142 + fVar126 + fVar26;
                  fVar113 = *(float *)((long)pvVar74 + lVar81 + 0x14);
                  pfVar1[0x10] = fVar94 * fVar90 + fVar142 * fVar35 +
                                 local_248 * fVar92 + fVar98 * fVar11 + pfVar1[0x10] +
                                 fVar93 * fVar39 +
                                 fVar91 * local_208 +
                                 fVar115 * local_228 + fVar144 * fVar19 + fVar119 * fVar28;
                  pfVar1[0x11] = fVar96 * fVar90 + fVar142 * fStack_2a4 +
                                 fStack_244 * fVar92 + fVar98 * fVar12 + pfVar1[0x11] +
                                 fVar93 * fStack_2c4 +
                                 fVar91 * fStack_204 +
                                 fVar115 * fStack_224 + fVar144 * fVar20 + fVar119 * fVar29;
                  pfVar1[0x12] = fVar97 * fVar90 + fVar142 * fVar36 +
                                 fStack_240 * fVar92 + fVar98 * fVar13 + pfVar1[0x12] +
                                 fVar93 * fVar40 +
                                 fVar91 * fStack_200 +
                                 fVar115 * fStack_220 + fVar144 * fVar21 + fVar119 * fVar30;
                  pfVar1[0x13] = fVar120 * fVar90 + fVar142 * fStack_29c +
                                 fStack_23c * fVar92 + fVar98 * fVar14 + pfVar1[0x13] +
                                 fVar93 * fStack_2bc +
                                 fVar91 * fStack_1fc +
                                 fVar115 * fStack_21c + fVar144 * fVar22 + fVar119 * fVar31;
                  pfVar1[0x14] = fVar122 * fVar90 + fVar142 * fVar37 +
                                 fStack_238 * fVar92 + fVar98 * fVar15 + pfVar1[0x14] +
                                 fVar93 * fVar41 +
                                 fVar91 * fStack_1f8 +
                                 fVar115 * fStack_218 + fVar144 * fVar23 + fVar119 * fVar32;
                  pfVar1[0x15] = fVar138 * fVar90 + fVar142 * fStack_294 +
                                 fStack_234 * fVar92 + fVar98 * fVar16 + pfVar1[0x15] +
                                 fVar93 * fStack_2b4 +
                                 fVar91 * fStack_1f4 +
                                 fVar115 * fStack_214 + fVar144 * fVar24 + fVar119 * fVar33;
                  pfVar1[0x16] = fVar95 * fVar90 + fVar142 * fVar38 +
                                 fStack_230 * fVar92 + fVar98 * fVar17 + pfVar1[0x16] +
                                 fVar93 * fVar42 +
                                 fVar91 * fStack_1f0 +
                                 fVar115 * fStack_210 + fVar144 * fVar25 + fVar119 * fVar34;
                  pfVar1[0x17] = fVar102;
                  fVar102 = fStack_28c + fVar102;
                  fVar142 = fVar94 * fVar144 + fVar98 * fVar35 +
                            fVar119 * local_248 + fVar115 * fVar11 + pfVar1[0x18];
                  fVar90 = fVar96 * fVar144 + fVar98 * fStack_2a4 +
                           fVar119 * fStack_244 + fVar115 * fVar12 + pfVar1[0x19];
                  fVar92 = fVar97 * fVar144 + fVar98 * fVar36 +
                           fVar119 * fStack_240 + fVar115 * fVar13 + pfVar1[0x1a];
                  fVar94 = fVar120 * fVar144 + fVar98 * fStack_29c +
                           fVar119 * fStack_23c + fVar115 * fVar14 + pfVar1[0x1b];
                  fVar96 = fVar122 * fVar144 + fVar98 * fVar37 +
                           fVar119 * fStack_238 + fVar115 * fVar15 + pfVar1[0x1c];
                  fVar97 = fVar138 * fVar144 + fVar98 * fStack_294 +
                           fVar119 * fStack_234 + fVar115 * fVar16 + pfVar1[0x1d];
                  fVar115 = fVar95 * fVar144 + fVar98 * fVar38 +
                            fVar119 * fStack_230 + fVar115 * fVar17 + pfVar1[0x1e];
                  fVar98 = fVar102 + fVar98 + fStack_1ec + pfVar1[0x1f];
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar98,CONCAT424(fVar115,CONCAT420(fVar97,CONCAT416(
                                                  fVar96,CONCAT412(fVar94,CONCAT48(fVar92,CONCAT44(
                                                  fVar90,fVar142))))))));
                  auVar87._0_4_ =
                       fVar142 + fVar91 * local_328 + fVar93 * fVar28 + fVar140 * local_228 +
                                 fVar106 * local_208 + fVar113 * fVar39;
                  auVar87._4_4_ =
                       fVar90 + fVar91 * fVar20 + fVar93 * fVar29 + fVar140 * fStack_224 +
                                fVar106 * fStack_204 + fVar113 * fStack_2c4;
                  auVar87._8_4_ =
                       fVar92 + fVar91 * fStack_320 + fVar93 * fVar30 + fVar140 * fStack_220 +
                                fVar106 * fStack_200 + fVar113 * fVar40;
                  auVar87._12_4_ =
                       fVar94 + fVar91 * fVar22 + fVar93 * fVar31 + fVar140 * fStack_21c +
                                fVar106 * fStack_1fc + fVar113 * fStack_2bc;
                  auVar87._16_4_ =
                       fVar96 + fVar91 * fStack_318 + fVar93 * fVar32 + fVar140 * fStack_218 +
                                fVar106 * fStack_1f8 + fVar113 * fVar41;
                  auVar87._20_4_ =
                       fVar97 + fVar91 * fVar24 + fVar93 * fVar33 + fVar140 * fStack_214 +
                                fVar106 * fStack_1f4 + fVar113 * fStack_2b4;
                  auVar87._24_4_ =
                       fVar115 + fVar91 * fStack_310 + fVar93 * fVar34 + fVar140 * fStack_210 +
                                 fVar106 * fStack_1f0 + fVar113 * fVar42;
                  auVar87._28_4_ = fVar98 + fVar102 + fVar93 + fVar102 + fVar102 + fVar102;
                  *(undefined1 (*) [32])(pfVar1 + 0x18) = auVar87;
                  lVar81 = lVar81 + 0x10;
                  iVar73 = iVar73 + 4;
                  pauVar77 = (undefined1 (*) [32])(pfVar1 + 0x20);
                } while (iVar73 < (int)uVar6);
                pvVar82 = (void *)((long)pvVar82 + lVar81);
                pvVar84 = (void *)((long)pvVar84 + lVar81);
                pvVar74 = (void *)((long)pvVar74 + lVar81);
                auVar116 = ZEXT3264(auVar86);
                pauVar77 = pauVar85 + 4;
                fVar115 = local_268;
                fVar140 = fStack_264;
                fVar142 = fStack_260;
                fVar91 = fStack_25c;
                fVar106 = fStack_258;
                fVar90 = fStack_254;
                fVar93 = fStack_250;
                fVar105 = local_328;
                fVar126 = fStack_320;
                fVar110 = fStack_318;
                fVar111 = fStack_310;
                fVar113 = local_248;
                fVar92 = fStack_244;
                fVar98 = fStack_240;
                fVar144 = fStack_23c;
                fVar119 = fStack_238;
                fVar94 = fStack_234;
                fVar96 = fStack_230;
                fVar103 = local_2a8;
                fVar97 = fStack_2a4;
                fVar108 = fStack_2a0;
                fVar120 = fStack_29c;
                fVar121 = fStack_298;
                fVar122 = fStack_294;
                fVar107 = fStack_290;
                fVar137 = local_2c8;
                fVar138 = fStack_2c4;
                fVar139 = fStack_2c0;
                fVar95 = fStack_2bc;
                fVar109 = fStack_2b8;
                fVar102 = fStack_2b4;
                in_register_0000159c = fVar27;
                uVar66 = uVar6 & 0xfffffffc;
              }
              if ((int)(uVar66 | 1) < (int)uVar6) {
                lVar81 = 0;
                pauVar71 = pauVar77;
                uVar65 = uVar66;
                do {
                  pauVar85 = pauVar71;
                  fVar115 = *(float *)((long)pvVar82 + lVar81);
                  fVar140 = *(float *)((long)pvVar82 + lVar81 + 4);
                  fVar142 = *(float *)((long)pvVar82 + lVar81 + 8);
                  fVar91 = *(float *)((long)pvVar84 + lVar81);
                  fVar106 = *(float *)((long)pvVar84 + lVar81 + 4);
                  fVar90 = *(float *)((long)pvVar84 + lVar81 + 8);
                  fVar93 = *(float *)((long)pvVar74 + lVar81);
                  fVar113 = *(float *)((long)pvVar74 + lVar81 + 4);
                  fVar144 = in_register_0000159c + in_ZMM1._28_4_;
                  fVar92 = *(float *)((long)pvVar74 + lVar81 + 8);
                  pauVar71 = (undefined1 (*) [32])((long)pauVar77[2] + lVar81 * 2 * 4);
                  fVar95 = *(float *)((long)pauVar71[-2] + 4);
                  fVar102 = *(float *)((long)pauVar71[-2] + 8);
                  fVar105 = *(float *)((long)pauVar71[-2] + 0xc);
                  fVar126 = *(float *)((long)pauVar71[-2] + 0x10);
                  fVar110 = *(float *)((long)pauVar71[-2] + 0x14);
                  fVar111 = *(float *)((long)pauVar71[-2] + 0x18);
                  fVar119 = auVar116._0_4_;
                  fVar94 = auVar116._4_4_;
                  fVar96 = auVar116._8_4_;
                  fVar97 = auVar116._12_4_;
                  fVar120 = auVar116._16_4_;
                  fVar122 = auVar116._20_4_;
                  fVar138 = auVar116._24_4_;
                  in_register_0000159c = *(float *)((long)pvVar82 + lVar81 + 0xc);
                  fVar98 = *(float *)((long)pvVar84 + lVar81 + 0xc);
                  fVar103 = fVar93 + fVar93 + fVar144 + fVar115 + *(float *)((long)pauVar71[-2] +
                                                                            0x1c) +
                            fVar144 + fVar144 + fVar144 + fVar91;
                  fVar144 = *(float *)((long)pvVar74 + lVar81 + 0xc);
                  *(float *)pauVar71[-2] =
                       fVar92 * local_2c8 +
                       fVar93 * local_248 +
                       fVar106 * local_328 + fVar115 * local_2a8 + *(float *)pauVar71[-2] +
                       fVar113 * fVar28 +
                       fVar90 * fVar119 +
                       fVar142 * local_228 + fVar140 * fVar11 + fVar91 * local_268;
                  *(float *)((long)pauVar71[-2] + 4) =
                       fVar92 * fStack_2c4 +
                       fVar93 * fStack_244 + fVar106 * fVar20 + fVar115 * fStack_2a4 + fVar95 +
                       fVar113 * fVar29 +
                       fVar90 * fVar94 +
                       fVar142 * fStack_224 + fVar140 * fVar12 + fVar91 * fStack_264;
                  *(float *)((long)pauVar71[-2] + 8) =
                       fVar92 * fStack_2c0 +
                       fVar93 * fStack_240 + fVar106 * fStack_320 + fVar115 * fStack_2a0 + fVar102 +
                       fVar113 * fVar30 +
                       fVar90 * fVar96 +
                       fVar142 * fStack_220 + fVar140 * fVar13 + fVar91 * fStack_260;
                  *(float *)((long)pauVar71[-2] + 0xc) =
                       fVar92 * fStack_2bc +
                       fVar93 * fStack_23c + fVar106 * fVar22 + fVar115 * fStack_29c + fVar105 +
                       fVar113 * fVar31 +
                       fVar90 * fVar97 +
                       fVar142 * fStack_21c + fVar140 * fVar14 + fVar91 * fStack_25c;
                  *(float *)((long)pauVar71[-2] + 0x10) =
                       fVar92 * fStack_2b8 +
                       fVar93 * fStack_238 + fVar106 * fStack_318 + fVar115 * fStack_298 + fVar126 +
                       fVar113 * fVar32 +
                       fVar90 * fVar120 +
                       fVar142 * fStack_218 + fVar140 * fVar15 + fVar91 * fStack_258;
                  *(float *)((long)pauVar71[-2] + 0x14) =
                       fVar92 * fStack_2b4 +
                       fVar93 * fStack_234 + fVar106 * fVar24 + fVar115 * fStack_294 + fVar110 +
                       fVar113 * fVar33 +
                       fVar90 * fVar122 +
                       fVar142 * fStack_214 + fVar140 * fVar16 + fVar91 * fStack_254;
                  *(float *)((long)pauVar71[-2] + 0x18) =
                       fVar92 * fVar42 +
                       fVar93 * fStack_230 + fVar106 * fStack_310 + fVar115 * fStack_290 + fVar111 +
                       fVar113 * fVar34 +
                       fVar90 * fVar138 +
                       fVar142 * fStack_210 + fVar140 * fVar17 + fVar91 * fStack_250;
                  *(float *)((long)pauVar71[-2] + 0x1c) = fVar103;
                  auVar116 = ZEXT3264(auVar116._0_32_);
                  fVar126 = fVar106 + fVar140 + fVar140 + fVar103;
                  fVar115 = fVar106 * local_268 + fVar90 * local_328 +
                            fVar142 * fVar11 + fVar140 * local_2a8 + *(float *)pauVar71[-1];
                  fVar91 = fVar106 * fStack_264 + fVar90 * fVar20 +
                           fVar142 * fVar12 + fVar140 * fStack_2a4 +
                           *(float *)((long)pauVar71[-1] + 4);
                  fVar93 = fVar106 * fStack_260 + fVar90 * fStack_320 +
                           fVar142 * fVar13 + fVar140 * fStack_2a0 +
                           *(float *)((long)pauVar71[-1] + 8);
                  fVar95 = fVar106 * fStack_25c + fVar90 * fVar22 +
                           fVar142 * fVar14 + fVar140 * fStack_29c +
                           *(float *)((long)pauVar71[-1] + 0xc);
                  fVar102 = fVar106 * fStack_258 + fVar90 * fStack_318 +
                            fVar142 * fVar15 + fVar140 * fStack_298 +
                            *(float *)((long)pauVar71[-1] + 0x10);
                  fVar105 = fVar106 * fStack_254 + fVar90 * fVar24 +
                            fVar142 * fVar16 + fVar140 * fStack_294 +
                            *(float *)((long)pauVar71[-1] + 0x14);
                  fVar140 = fVar106 * fStack_250 + fVar90 * fStack_310 +
                            fVar142 * fVar17 + fVar140 * fStack_290 +
                            *(float *)((long)pauVar71[-1] + 0x18);
                  fVar142 = fVar126 + *(float *)((long)pauVar71[-1] + 0x1c);
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar142,CONCAT424(fVar140,CONCAT420(fVar105,CONCAT416
                                                  (fVar102,CONCAT412(fVar95,CONCAT48(fVar93,CONCAT44
                                                  (fVar91,fVar115))))))));
                  auVar88._0_4_ =
                       fVar115 + fVar113 * local_248 + fVar28 * fVar92 +
                                 in_register_0000159c * local_228 + fVar98 * fVar119 +
                                 local_2c8 * fVar144;
                  auVar88._4_4_ =
                       fVar91 + fVar113 * fStack_244 + fVar29 * fVar92 +
                                in_register_0000159c * fStack_224 + fVar98 * fVar94 +
                                fStack_2c4 * fVar144;
                  auVar88._8_4_ =
                       fVar93 + fVar113 * fStack_240 + fVar30 * fVar92 +
                                in_register_0000159c * fStack_220 + fVar98 * fVar96 +
                                fStack_2c0 * fVar144;
                  auVar88._12_4_ =
                       fVar95 + fVar113 * fStack_23c + fVar31 * fVar92 +
                                in_register_0000159c * fStack_21c + fVar98 * fVar97 +
                                fStack_2bc * fVar144;
                  auVar88._16_4_ =
                       fVar102 + fVar113 * fStack_238 + fVar32 * fVar92 +
                                 in_register_0000159c * fStack_218 + fVar98 * fVar120 +
                                 fStack_2b8 * fVar144;
                  auVar88._20_4_ =
                       fVar105 + fVar113 * fStack_234 + fVar33 * fVar92 +
                                 in_register_0000159c * fStack_214 + fVar98 * fVar122 +
                                 fStack_2b4 * fVar144;
                  auVar88._24_4_ =
                       fVar140 + fVar113 * fStack_230 + fVar34 * fVar92 +
                                 in_register_0000159c * fStack_210 + fVar98 * fVar138 +
                                 fVar42 * fVar144;
                  auVar88._28_4_ = fVar142 + fStack_28c + fVar10 + fVar10 + fVar10 + fVar126;
                  pauVar71[-1] = auVar88;
                  uVar66 = uVar65 + 2;
                  lVar81 = lVar81 + 8;
                  iVar73 = uVar65 + 3;
                  uVar65 = uVar66;
                } while (iVar73 < (int)uVar6);
                pauVar77 = pauVar85 + 2;
                pvVar82 = (void *)((long)pvVar82 + lVar81);
                pvVar84 = (void *)((long)pvVar84 + lVar81);
                pvVar74 = (void *)((long)pvVar74 + lVar81);
                fVar115 = local_268;
                fVar140 = fStack_264;
                fVar142 = fStack_260;
                fVar91 = fStack_25c;
                fVar106 = fStack_258;
                fVar90 = fStack_254;
                fVar93 = fStack_250;
                fVar105 = local_328;
                fVar126 = fStack_320;
                fVar110 = fStack_318;
                fVar111 = fStack_310;
                fVar113 = local_248;
                fVar92 = fStack_244;
                fVar98 = fStack_240;
                fVar144 = fStack_23c;
                fVar119 = fStack_238;
                fVar94 = fStack_234;
                fVar96 = fStack_230;
                fVar103 = local_2a8;
                fVar97 = fStack_2a4;
                fVar108 = fStack_2a0;
                fVar120 = fStack_29c;
                fVar121 = fStack_298;
                fVar122 = fStack_294;
                fVar107 = fStack_290;
                fVar137 = local_2c8;
                fVar138 = fStack_2c4;
                fVar139 = fStack_2c0;
                fVar95 = fStack_2bc;
                fVar109 = fStack_2b8;
                fVar102 = fStack_2b4;
              }
              iVar73 = uVar6 - uVar66;
              pauVar71 = pauVar77;
              if (iVar73 != 0 && (int)uVar66 <= (int)uVar6) {
                lVar81 = 0;
                do {
                  fVar127 = *(float *)((long)pvVar82 + lVar81);
                  fVar131 = *(float *)((long)pvVar82 + lVar81 + 4);
                  fVar132 = *(float *)((long)pvVar82 + lVar81 + 8);
                  fVar133 = *(float *)((long)pvVar84 + lVar81);
                  fVar117 = *(float *)((long)pvVar84 + lVar81 + 4);
                  fVar112 = *(float *)((long)pvVar84 + lVar81 + 8);
                  pfVar1 = (float *)((long)*pauVar77 + lVar81 * 2 * 4);
                  fVar114 = *(float *)((long)pvVar74 + lVar81);
                  fVar123 = *(float *)((long)pvVar74 + lVar81 + 4);
                  fVar134 = *(float *)((long)pvVar74 + lVar81 + 8);
                  fVar135 = fVar131 * fVar11 + local_228 * fVar132 + fVar133 * fVar115 +
                            auVar116._0_4_ * fVar112 + fVar28 * fVar123;
                  fVar143 = fVar131 * fVar12 + fStack_224 * fVar132 + fVar133 * fVar140 +
                            auVar116._4_4_ * fVar112 + fVar29 * fVar123;
                  fVar141 = fVar131 * fVar13 + fStack_220 * fVar132 + fVar133 * fVar142 +
                            auVar116._8_4_ * fVar112 + fVar30 * fVar123;
                  fVar124 = fVar131 * fVar14 + fStack_21c * fVar132 + fVar133 * fVar91 +
                            auVar116._12_4_ * fVar112 + fVar31 * fVar123;
                  fVar118 = fVar131 * fVar15 + fStack_218 * fVar132 + fVar133 * fVar106 +
                            auVar116._16_4_ * fVar112 + fVar32 * fVar123;
                  fVar125 = fVar131 * fVar16 + fStack_214 * fVar132 + fVar133 * fVar90 +
                            auVar116._20_4_ * fVar112 + fVar33 * fVar123;
                  fVar136 = fVar131 * fVar17 + fStack_210 * fVar132 + fVar133 * fVar93 +
                            auVar116._24_4_ * fVar112 + fVar34 * fVar123;
                  fVar123 = fVar131 + fVar132 + fVar133 + fVar112 + fVar123;
                  in_ZMM1 = ZEXT3264(CONCAT428(fVar123,CONCAT424(fVar136,CONCAT420(fVar125,CONCAT416
                                                  (fVar118,CONCAT412(fVar124,CONCAT48(fVar141,
                                                  CONCAT44(fVar143,fVar135))))))));
                  auVar89._0_4_ =
                       fVar103 * fVar127 + *pfVar1 + fVar117 * fVar105 + fVar114 * fVar113 +
                       fVar137 * fVar134 + fVar135;
                  auVar89._4_4_ =
                       fVar97 * fVar127 + pfVar1[1] + fVar117 * fVar20 + fVar114 * fVar92 +
                       fVar138 * fVar134 + fVar143;
                  auVar89._8_4_ =
                       fVar108 * fVar127 + pfVar1[2] + fVar117 * fVar126 + fVar114 * fVar98 +
                       fVar139 * fVar134 + fVar141;
                  auVar89._12_4_ =
                       fVar120 * fVar127 + pfVar1[3] + fVar117 * fVar22 + fVar114 * fVar144 +
                       fVar95 * fVar134 + fVar124;
                  auVar89._16_4_ =
                       fVar121 * fVar127 + pfVar1[4] + fVar117 * fVar110 + fVar114 * fVar119 +
                       fVar109 * fVar134 + fVar118;
                  auVar89._20_4_ =
                       fVar122 * fVar127 + pfVar1[5] + fVar117 * fVar24 + fVar114 * fVar94 +
                       fVar102 * fVar134 + fVar125;
                  auVar89._24_4_ =
                       fVar107 * fVar127 + pfVar1[6] + fVar117 * fVar111 + fVar114 * fVar96 +
                       fVar42 * fVar134 + fVar136;
                  auVar89._28_4_ = fVar127 + pfVar1[7] + fVar117 + fVar114 + fVar134 + fVar123;
                  *(undefined1 (*) [32])((long)*pauVar77 + lVar81 * 2 * 4) = auVar89;
                  pauVar71 = pauVar71 + 1;
                  lVar81 = lVar81 + 4;
                  iVar73 = iVar73 + -1;
                } while (iVar73 != 0);
                pvVar82 = (void *)((long)pvVar82 + lVar81);
                pvVar84 = (void *)((long)pvVar84 + lVar81);
                pvVar74 = (void *)((long)pvVar74 + lVar81);
              }
              pvVar82 = (void *)((long)pvVar82 + 8);
              pvVar84 = (void *)((long)pvVar84 + 8);
              pvVar74 = (void *)((long)pvVar74 + 8);
              iVar70 = iVar70 + 1;
            } while (iVar70 != iVar7);
          }
          pfVar79 = pfVar79 + 0x48;
          uVar78 = uVar78 + 1;
        } while (uVar78 != uVar5);
      }
      uVar83 = uVar83 + 1;
    } while ((long)uVar83 < (long)iVar8);
  }
  return;
}

Assistant:

static void conv3x3s1_pack1to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    int nn_outch = outch >> 1;
    int remain_outch_start = nn_outch << 1;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 2;

        Mat out0 = top_blob.channel(p);
        Mat out1 = top_blob.channel(p + 1);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        __m256 _bias1 = bias ? _mm256_loadu_ps((const float*)bias + (p + 1) * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);
        out1.fill(_bias1);

        const float* k0 = kernel.channel(p);
        const float* k1 = kernel.channel(p + 1);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0;
            float* outptr1 = out1;

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00_0 = _mm256_loadu_ps(k0);
            __m256 _k01_0 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02_0 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10_0 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11_0 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12_0 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20_0 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21_0 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22_0 = _mm256_loadu_ps(k0 + 64);

            __m256 _k00_1 = _mm256_loadu_ps(k1);
            __m256 _k01_1 = _mm256_loadu_ps(k1 + 8);
            __m256 _k02_1 = _mm256_loadu_ps(k1 + 16);
            __m256 _k10_1 = _mm256_loadu_ps(k1 + 24);
            __m256 _k11_1 = _mm256_loadu_ps(k1 + 32);
            __m256 _k12_1 = _mm256_loadu_ps(k1 + 40);
            __m256 _k20_1 = _mm256_loadu_ps(k1 + 48);
            __m256 _k21_1 = _mm256_loadu_ps(k1 + 56);
            __m256 _k22_1 = _mm256_loadu_ps(k1 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    __m256 _sum02 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _sum12 = _mm256_loadu_ps(outptr1 + 16);

                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);

                    _sum02 = _mm256_comp_fmadd_ps(_r03, _k00_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r04, _k01_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r05, _k02_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r13, _k10_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r14, _k11_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r15, _k12_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r23, _k20_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r24, _k21_0, _sum02);
                    _sum02 = _mm256_comp_fmadd_ps(_r25, _k22_0, _sum02);

                    _sum12 = _mm256_comp_fmadd_ps(_r03, _k00_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r04, _k01_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r05, _k02_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r13, _k10_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r14, _k11_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r15, _k12_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r23, _k20_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r24, _k21_1, _sum12);
                    _sum12 = _mm256_comp_fmadd_ps(_r25, _k22_1, _sum12);

                    _mm256_storeu_ps(outptr0 + 16, _sum02);
                    _mm256_storeu_ps(outptr1 + 16, _sum12);

                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);

                    __m256 _sum03 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _sum13 = _mm256_loadu_ps(outptr1 + 24);

                    _sum03 = _mm256_comp_fmadd_ps(_r04, _k00_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r05, _k01_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r06, _k02_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r14, _k10_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r15, _k11_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r16, _k12_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r24, _k20_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r25, _k21_0, _sum03);
                    _sum03 = _mm256_comp_fmadd_ps(_r26, _k22_0, _sum03);

                    _sum13 = _mm256_comp_fmadd_ps(_r04, _k00_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r05, _k01_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r06, _k02_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r14, _k10_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r15, _k11_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r16, _k12_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r24, _k20_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r25, _k21_1, _sum13);
                    _sum13 = _mm256_comp_fmadd_ps(_r26, _k22_1, _sum13);

                    _mm256_storeu_ps(outptr0 + 24, _sum03);
                    _mm256_storeu_ps(outptr1 + 24, _sum13);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                    outptr1 += 32;
                }

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    __m256 _sum01 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _sum11 = _mm256_loadu_ps(outptr1 + 8);

                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);

                    _sum01 = _mm256_comp_fmadd_ps(_r02, _k00_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r03, _k01_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r04, _k02_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r12, _k10_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r13, _k11_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r14, _k12_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r22, _k20_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r23, _k21_0, _sum01);
                    _sum01 = _mm256_comp_fmadd_ps(_r24, _k22_0, _sum01);

                    _sum11 = _mm256_comp_fmadd_ps(_r02, _k00_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r03, _k01_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r04, _k02_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r12, _k10_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r13, _k11_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r14, _k12_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r22, _k20_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r23, _k21_1, _sum11);
                    _sum11 = _mm256_comp_fmadd_ps(_r24, _k22_1, _sum11);

                    _mm256_storeu_ps(outptr0 + 8, _sum01);
                    _mm256_storeu_ps(outptr1 + 8, _sum11);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                    outptr1 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum00 = _mm256_loadu_ps(outptr0);
                    __m256 _sum10 = _mm256_loadu_ps(outptr1);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum00 = _mm256_comp_fmadd_ps(_r01, _k00_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r02, _k01_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r03, _k02_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r11, _k10_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r12, _k11_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r13, _k12_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r21, _k20_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r22, _k21_0, _sum00);
                    _sum00 = _mm256_comp_fmadd_ps(_r23, _k22_0, _sum00);

                    _sum10 = _mm256_comp_fmadd_ps(_r01, _k00_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r02, _k01_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r03, _k02_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r11, _k10_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r12, _k11_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r13, _k12_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r21, _k20_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r22, _k21_1, _sum10);
                    _sum10 = _mm256_comp_fmadd_ps(_r23, _k22_1, _sum10);

                    _mm256_storeu_ps(outptr0, _sum00);
                    _mm256_storeu_ps(outptr1, _sum10);

                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                    outptr1 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
            k1 += 9 * 8;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        const float* k0 = kernel.channel(p);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);
            const float* r2 = img0.row(2);

            __m256 _k00 = _mm256_loadu_ps(k0);
            __m256 _k01 = _mm256_loadu_ps(k0 + 8);
            __m256 _k02 = _mm256_loadu_ps(k0 + 16);
            __m256 _k10 = _mm256_loadu_ps(k0 + 24);
            __m256 _k11 = _mm256_loadu_ps(k0 + 32);
            __m256 _k12 = _mm256_loadu_ps(k0 + 40);
            __m256 _k20 = _mm256_loadu_ps(k0 + 48);
            __m256 _k21 = _mm256_loadu_ps(k0 + 56);
            __m256 _k22 = _mm256_loadu_ps(k0 + 64);

            int i = 0;

            for (; i < outh; i++)
            {
                int j = 0;
                for (; j + 3 < outw; j += 4)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    __m256 _sum2 = _mm256_loadu_ps(outptr0 + 16);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r25 = _mm256_broadcast_ss(r2 + 4);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    _sum2 = _mm256_comp_fmadd_ps(_r03, _k00, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r04, _k01, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r05, _k02, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r13, _k10, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r14, _k11, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r15, _k12, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r23, _k20, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r24, _k21, _sum2);
                    _sum2 = _mm256_comp_fmadd_ps(_r25, _k22, _sum2);

                    __m256 _sum3 = _mm256_loadu_ps(outptr0 + 24);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r26 = _mm256_broadcast_ss(r2 + 5);
                    _mm256_storeu_ps(outptr0 + 16, _sum2);

                    _sum3 = _mm256_comp_fmadd_ps(_r04, _k00, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r05, _k01, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r06, _k02, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r14, _k10, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r15, _k11, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r16, _k12, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r24, _k20, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r25, _k21, _sum3);
                    _sum3 = _mm256_comp_fmadd_ps(_r26, _k22, _sum3);

                    _mm256_storeu_ps(outptr0 + 24, _sum3);

                    r0 += 4;
                    r1 += 4;
                    r2 += 4;
                    outptr0 += 32;
                }
                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r24 = _mm256_broadcast_ss(r2 + 3);
                    _mm256_storeu_ps(outptr0, _sum0);

                    _sum1 = _mm256_comp_fmadd_ps(_r02, _k00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r03, _k01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r04, _k02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r12, _k10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r13, _k11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r14, _k12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r22, _k20, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r23, _k21, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_r24, _k22, _sum1);

                    _mm256_storeu_ps(outptr0 + 8, _sum1);

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    outptr0 += 16;
                }
                for (; j < outw; j++)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);

                    __m256 _r01 = _mm256_broadcast_ss(r0);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r11 = _mm256_broadcast_ss(r1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r21 = _mm256_broadcast_ss(r2);
                    __m256 _r22 = _mm256_broadcast_ss(r2 + 1);
                    __m256 _r23 = _mm256_broadcast_ss(r2 + 2);

                    _sum0 = _mm256_comp_fmadd_ps(_r01, _k00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r02, _k01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r03, _k02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r11, _k10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r12, _k11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r13, _k12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r21, _k20, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r22, _k21, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_r23, _k22, _sum0);

                    _mm256_storeu_ps(outptr0, _sum0);
                    r0 += 1;
                    r1 += 1;
                    r2 += 1;
                    outptr0 += 8;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

            k0 += 9 * 8;
        }
    }
}